

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

bool embree::avx2::CurveNvIntersectorK<8,4>::
     occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  int iVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  ulong uVar68;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  uint uVar78;
  ulong uVar79;
  long lVar80;
  ulong uVar81;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  uint uVar82;
  uint uVar83;
  ulong uVar84;
  byte bVar85;
  bool bVar86;
  byte bVar87;
  float fVar88;
  undefined8 uVar90;
  undefined1 auVar91 [16];
  undefined4 uVar89;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar118;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar92 [16];
  undefined1 auVar111 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar112 [32];
  undefined1 auVar117 [64];
  undefined1 extraout_var_00 [60];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar125 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar132 [16];
  undefined1 auVar140 [32];
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float fVar172;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar194;
  float fVar195;
  float fVar196;
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar173;
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar183 [16];
  undefined1 auVar193 [32];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [64];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar244 [64];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [16];
  float fVar255;
  float fVar257;
  float fVar258;
  float fVar259;
  undefined1 auVar250 [32];
  float fVar256;
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [32];
  undefined1 auVar263 [28];
  float fVar269;
  float fVar270;
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [16];
  float fVar278;
  float fVar279;
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_c0c;
  undefined1 local_c00 [8];
  float fStack_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  float fStack_be8;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  RTCFilterFunctionNArguments local_a70;
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [16];
  undefined1 local_970 [16];
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  undefined1 auStack_950 [16];
  undefined1 local_940 [16];
  undefined1 local_930 [16];
  Primitive *local_920;
  Primitive *local_918;
  ulong local_910;
  ulong local_908;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined4 local_7c0;
  undefined4 uStack_7bc;
  undefined4 uStack_7b8;
  undefined4 uStack_7b4;
  uint local_7b0;
  uint uStack_7ac;
  uint uStack_7a8;
  uint uStack_7a4;
  RTCHitN local_7a0 [16];
  undefined1 auStack_790 [16];
  undefined4 local_780;
  undefined4 uStack_77c;
  undefined4 uStack_778;
  undefined4 uStack_774;
  undefined1 local_770 [16];
  undefined1 local_760 [16];
  undefined8 local_750;
  undefined8 uStack_748;
  undefined1 local_740 [16];
  uint local_730;
  uint uStack_72c;
  uint uStack_728;
  uint uStack_724;
  uint uStack_720;
  uint uStack_71c;
  uint uStack_718;
  uint uStack_714;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined4 uStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined4 uStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  float fStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 extraout_var [60];
  undefined1 auVar245 [32];
  
  PVar7 = prim[1];
  uVar79 = (ulong)(byte)PVar7;
  local_920 = prim + uVar79 * 0x19 + 0x16;
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar11 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar11 = vinsertps_avx(auVar11,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar88 = *(float *)(prim + uVar79 * 0x19 + 0x12);
  auVar10 = vsubps_avx(auVar10,*(undefined1 (*) [16])(prim + uVar79 * 0x19 + 6));
  auVar91._0_4_ = fVar88 * auVar10._0_4_;
  auVar91._4_4_ = fVar88 * auVar10._4_4_;
  auVar91._8_4_ = fVar88 * auVar10._8_4_;
  auVar91._12_4_ = fVar88 * auVar10._12_4_;
  auVar211._0_4_ = fVar88 * auVar11._0_4_;
  auVar211._4_4_ = fVar88 * auVar11._4_4_;
  auVar211._8_4_ = fVar88 * auVar11._8_4_;
  auVar211._12_4_ = fVar88 * auVar11._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar79 * 4 + 6);
  auVar101 = vpmovsxbd_avx2(auVar10);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar79 * 5 + 6);
  auVar231 = vpmovsxbd_avx2(auVar11);
  auVar231 = vcvtdq2ps_avx(auVar231);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + uVar79 * 6 + 6);
  auVar12 = vpmovsxbd_avx2(auVar1);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + uVar79 * 0xb + 6);
  auVar13 = vpmovsxbd_avx2(auVar2);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar79 * 0xc + 6);
  auVar14 = vpmovsxbd_avx2(auVar97);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar79 * 0xd + 6);
  auVar15 = vpmovsxbd_avx2(auVar3);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar79 * 0x12 + 6);
  auVar16 = vpmovsxbd_avx2(auVar4);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar79 * 0x13 + 6);
  auVar17 = vpmovsxbd_avx2(auVar5);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar79 * 0x14 + 6);
  auVar207 = vpmovsxbd_avx2(auVar6);
  auVar207 = vcvtdq2ps_avx(auVar207);
  auVar264._4_4_ = auVar211._0_4_;
  auVar264._0_4_ = auVar211._0_4_;
  auVar264._8_4_ = auVar211._0_4_;
  auVar264._12_4_ = auVar211._0_4_;
  auVar264._16_4_ = auVar211._0_4_;
  auVar264._20_4_ = auVar211._0_4_;
  auVar264._24_4_ = auVar211._0_4_;
  auVar264._28_4_ = auVar211._0_4_;
  auVar10 = vmovshdup_avx(auVar211);
  uVar90 = auVar10._0_8_;
  auVar276._8_8_ = uVar90;
  auVar276._0_8_ = uVar90;
  auVar276._16_8_ = uVar90;
  auVar276._24_8_ = uVar90;
  auVar10 = vshufps_avx(auVar211,auVar211,0xaa);
  fVar88 = auVar10._0_4_;
  auVar253._0_4_ = fVar88 * auVar12._0_4_;
  fVar118 = auVar10._4_4_;
  auVar253._4_4_ = fVar118 * auVar12._4_4_;
  auVar253._8_4_ = fVar88 * auVar12._8_4_;
  auVar253._12_4_ = fVar118 * auVar12._12_4_;
  auVar253._16_4_ = fVar88 * auVar12._16_4_;
  auVar253._20_4_ = fVar118 * auVar12._20_4_;
  auVar253._28_36_ = in_ZMM10._28_36_;
  auVar253._24_4_ = fVar88 * auVar12._24_4_;
  auVar248._0_4_ = auVar15._0_4_ * fVar88;
  auVar248._4_4_ = auVar15._4_4_ * fVar118;
  auVar248._8_4_ = auVar15._8_4_ * fVar88;
  auVar248._12_4_ = auVar15._12_4_ * fVar118;
  auVar248._16_4_ = auVar15._16_4_ * fVar88;
  auVar248._20_4_ = auVar15._20_4_ * fVar118;
  auVar248._28_36_ = in_ZMM9._28_36_;
  auVar248._24_4_ = auVar15._24_4_ * fVar88;
  auVar205._0_4_ = auVar207._0_4_ * fVar88;
  auVar205._4_4_ = auVar207._4_4_ * fVar118;
  auVar205._8_4_ = auVar207._8_4_ * fVar88;
  auVar205._12_4_ = auVar207._12_4_ * fVar118;
  auVar205._16_4_ = auVar207._16_4_ * fVar88;
  auVar205._20_4_ = auVar207._20_4_ * fVar118;
  auVar205._24_4_ = auVar207._24_4_ * fVar88;
  auVar205._28_4_ = 0;
  auVar10 = vfmadd231ps_fma(auVar253._0_32_,auVar276,auVar231);
  auVar11 = vfmadd231ps_fma(auVar248._0_32_,auVar276,auVar14);
  auVar1 = vfmadd231ps_fma(auVar205,auVar17,auVar276);
  auVar2 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar264,auVar101);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar264,auVar13);
  auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar16,auVar264);
  auVar265._4_4_ = auVar91._0_4_;
  auVar265._0_4_ = auVar91._0_4_;
  auVar265._8_4_ = auVar91._0_4_;
  auVar265._12_4_ = auVar91._0_4_;
  auVar265._16_4_ = auVar91._0_4_;
  auVar265._20_4_ = auVar91._0_4_;
  auVar265._24_4_ = auVar91._0_4_;
  auVar265._28_4_ = auVar91._0_4_;
  auVar10 = vmovshdup_avx(auVar91);
  uVar90 = auVar10._0_8_;
  auVar277._8_8_ = uVar90;
  auVar277._0_8_ = uVar90;
  auVar277._16_8_ = uVar90;
  auVar277._24_8_ = uVar90;
  auVar10 = vshufps_avx(auVar91,auVar91,0xaa);
  fVar88 = auVar10._0_4_;
  auVar185._0_4_ = fVar88 * auVar12._0_4_;
  fVar118 = auVar10._4_4_;
  auVar185._4_4_ = fVar118 * auVar12._4_4_;
  auVar185._8_4_ = fVar88 * auVar12._8_4_;
  auVar185._12_4_ = fVar118 * auVar12._12_4_;
  auVar185._16_4_ = fVar88 * auVar12._16_4_;
  auVar185._20_4_ = fVar118 * auVar12._20_4_;
  auVar185._24_4_ = fVar88 * auVar12._24_4_;
  auVar185._28_4_ = 0;
  auVar189._4_4_ = auVar15._4_4_ * fVar118;
  auVar189._0_4_ = auVar15._0_4_ * fVar88;
  auVar189._8_4_ = auVar15._8_4_ * fVar88;
  auVar189._12_4_ = auVar15._12_4_ * fVar118;
  auVar189._16_4_ = auVar15._16_4_ * fVar88;
  auVar189._20_4_ = auVar15._20_4_ * fVar118;
  auVar189._24_4_ = auVar15._24_4_ * fVar88;
  auVar189._28_4_ = auVar12._28_4_;
  auVar12._4_4_ = auVar207._4_4_ * fVar118;
  auVar12._0_4_ = auVar207._0_4_ * fVar88;
  auVar12._8_4_ = auVar207._8_4_ * fVar88;
  auVar12._12_4_ = auVar207._12_4_ * fVar118;
  auVar12._16_4_ = auVar207._16_4_ * fVar88;
  auVar12._20_4_ = auVar207._20_4_ * fVar118;
  auVar12._24_4_ = auVar207._24_4_ * fVar88;
  auVar12._28_4_ = fVar118;
  auVar10 = vfmadd231ps_fma(auVar185,auVar277,auVar231);
  auVar97 = vfmadd231ps_fma(auVar189,auVar277,auVar14);
  auVar3 = vfmadd231ps_fma(auVar12,auVar277,auVar17);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar265,auVar101);
  local_6e0._8_4_ = 0x7fffffff;
  local_6e0._0_8_ = 0x7fffffff7fffffff;
  local_6e0._12_4_ = 0x7fffffff;
  local_6e0._16_4_ = 0x7fffffff;
  local_6e0._20_4_ = 0x7fffffff;
  local_6e0._24_4_ = 0x7fffffff;
  local_6e0._28_4_ = 0x7fffffff;
  auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar265,auVar13);
  auVar101 = vandps_avx(ZEXT1632(auVar2),local_6e0);
  auVar250._8_4_ = 0x219392ef;
  auVar250._0_8_ = 0x219392ef219392ef;
  auVar250._12_4_ = 0x219392ef;
  auVar250._16_4_ = 0x219392ef;
  auVar250._20_4_ = 0x219392ef;
  auVar250._24_4_ = 0x219392ef;
  auVar250._28_4_ = 0x219392ef;
  auVar101 = vcmpps_avx(auVar101,auVar250,1);
  auVar231 = vblendvps_avx(ZEXT1632(auVar2),auVar250,auVar101);
  auVar101 = vandps_avx(ZEXT1632(auVar11),local_6e0);
  auVar101 = vcmpps_avx(auVar101,auVar250,1);
  auVar12 = vblendvps_avx(ZEXT1632(auVar11),auVar250,auVar101);
  auVar101 = vandps_avx(local_6e0,ZEXT1632(auVar1));
  auVar101 = vcmpps_avx(auVar101,auVar250,1);
  auVar13 = vrcpps_avx(auVar231);
  auVar101 = vblendvps_avx(ZEXT1632(auVar1),auVar250,auVar101);
  auVar230._8_4_ = 0x3f800000;
  auVar230._0_8_ = 0x3f8000003f800000;
  auVar230._12_4_ = 0x3f800000;
  auVar230._16_4_ = 0x3f800000;
  auVar230._20_4_ = 0x3f800000;
  auVar230._24_4_ = 0x3f800000;
  auVar230._28_4_ = 0x3f800000;
  auVar2 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar265,auVar16);
  auVar14 = vrcpps_avx(auVar12);
  auVar10 = vfnmadd213ps_fma(auVar231,auVar13,auVar230);
  auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar13,auVar13);
  auVar11 = vfnmadd213ps_fma(auVar12,auVar14,auVar230);
  auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar14,auVar14);
  auVar231 = vrcpps_avx(auVar101);
  auVar1 = vfnmadd213ps_fma(auVar101,auVar231,auVar230);
  auVar1 = vfmadd132ps_fma(ZEXT1632(auVar1),auVar231,auVar231);
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 7 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar4));
  auVar13._4_4_ = auVar10._4_4_ * auVar101._4_4_;
  auVar13._0_4_ = auVar10._0_4_ * auVar101._0_4_;
  auVar13._8_4_ = auVar10._8_4_ * auVar101._8_4_;
  auVar13._12_4_ = auVar10._12_4_ * auVar101._12_4_;
  auVar13._16_4_ = auVar101._16_4_ * 0.0;
  auVar13._20_4_ = auVar101._20_4_ * 0.0;
  auVar13._24_4_ = auVar101._24_4_ * 0.0;
  auVar13._28_4_ = auVar101._28_4_;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 9 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar4));
  auVar14._4_4_ = auVar10._4_4_ * auVar101._4_4_;
  auVar14._0_4_ = auVar10._0_4_ * auVar101._0_4_;
  auVar14._8_4_ = auVar10._8_4_ * auVar101._8_4_;
  auVar14._12_4_ = auVar10._12_4_ * auVar101._12_4_;
  auVar14._16_4_ = auVar101._16_4_ * 0.0;
  auVar14._20_4_ = auVar101._20_4_ * 0.0;
  auVar14._24_4_ = auVar101._24_4_ * 0.0;
  auVar14._28_4_ = auVar101._28_4_;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 0xe + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar97));
  auVar15._4_4_ = auVar11._4_4_ * auVar101._4_4_;
  auVar15._0_4_ = auVar11._0_4_ * auVar101._0_4_;
  auVar15._8_4_ = auVar11._8_4_ * auVar101._8_4_;
  auVar15._12_4_ = auVar11._12_4_ * auVar101._12_4_;
  auVar15._16_4_ = auVar101._16_4_ * 0.0;
  auVar15._20_4_ = auVar101._20_4_ * 0.0;
  auVar15._24_4_ = auVar101._24_4_ * 0.0;
  auVar15._28_4_ = auVar101._28_4_;
  auVar133._1_3_ = 0;
  auVar133[0] = PVar7;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar7 * 0x10 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar97));
  auVar16._4_4_ = auVar11._4_4_ * auVar101._4_4_;
  auVar16._0_4_ = auVar11._0_4_ * auVar101._0_4_;
  auVar16._8_4_ = auVar11._8_4_ * auVar101._8_4_;
  auVar16._12_4_ = auVar11._12_4_ * auVar101._12_4_;
  auVar16._16_4_ = auVar101._16_4_ * 0.0;
  auVar16._20_4_ = auVar101._20_4_ * 0.0;
  auVar16._24_4_ = auVar101._24_4_ * 0.0;
  auVar16._28_4_ = auVar101._28_4_;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 0x15 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar2));
  auVar17._4_4_ = auVar101._4_4_ * auVar1._4_4_;
  auVar17._0_4_ = auVar101._0_4_ * auVar1._0_4_;
  auVar17._8_4_ = auVar101._8_4_ * auVar1._8_4_;
  auVar17._12_4_ = auVar101._12_4_ * auVar1._12_4_;
  auVar17._16_4_ = auVar101._16_4_ * 0.0;
  auVar17._20_4_ = auVar101._20_4_ * 0.0;
  auVar17._24_4_ = auVar101._24_4_ * 0.0;
  auVar17._28_4_ = auVar101._28_4_;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 0x17 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar2));
  auVar207._4_4_ = auVar1._4_4_ * auVar101._4_4_;
  auVar207._0_4_ = auVar1._0_4_ * auVar101._0_4_;
  auVar207._8_4_ = auVar1._8_4_ * auVar101._8_4_;
  auVar207._12_4_ = auVar1._12_4_ * auVar101._12_4_;
  auVar207._16_4_ = auVar101._16_4_ * 0.0;
  auVar207._20_4_ = auVar101._20_4_ * 0.0;
  auVar207._24_4_ = auVar101._24_4_ * 0.0;
  auVar207._28_4_ = auVar101._28_4_;
  auVar101 = vpminsd_avx2(auVar13,auVar14);
  auVar231 = vpminsd_avx2(auVar15,auVar16);
  auVar101 = vmaxps_avx(auVar101,auVar231);
  uVar89 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar238._4_4_ = uVar89;
  auVar238._0_4_ = uVar89;
  auVar238._8_4_ = uVar89;
  auVar238._12_4_ = uVar89;
  auVar238._16_4_ = uVar89;
  auVar238._20_4_ = uVar89;
  auVar238._24_4_ = uVar89;
  auVar238._28_4_ = uVar89;
  auVar231 = vpminsd_avx2(auVar17,auVar207);
  auVar231 = vmaxps_avx(auVar231,auVar238);
  auVar101 = vmaxps_avx(auVar101,auVar231);
  local_3c0._4_4_ = auVar101._4_4_ * 0.99999964;
  local_3c0._0_4_ = auVar101._0_4_ * 0.99999964;
  local_3c0._8_4_ = auVar101._8_4_ * 0.99999964;
  local_3c0._12_4_ = auVar101._12_4_ * 0.99999964;
  local_3c0._16_4_ = auVar101._16_4_ * 0.99999964;
  local_3c0._20_4_ = auVar101._20_4_ * 0.99999964;
  local_3c0._24_4_ = auVar101._24_4_ * 0.99999964;
  local_3c0._28_4_ = auVar231._28_4_;
  auVar101 = vpmaxsd_avx2(auVar13,auVar14);
  auVar231 = vpmaxsd_avx2(auVar15,auVar16);
  auVar101 = vminps_avx(auVar101,auVar231);
  auVar231 = vpmaxsd_avx2(auVar17,auVar207);
  uVar89 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar102._4_4_ = uVar89;
  auVar102._0_4_ = uVar89;
  auVar102._8_4_ = uVar89;
  auVar102._12_4_ = uVar89;
  auVar102._16_4_ = uVar89;
  auVar102._20_4_ = uVar89;
  auVar102._24_4_ = uVar89;
  auVar102._28_4_ = uVar89;
  auVar231 = vminps_avx(auVar231,auVar102);
  auVar101 = vminps_avx(auVar101,auVar231);
  auVar226._4_4_ = auVar101._4_4_ * 1.0000004;
  auVar226._0_4_ = auVar101._0_4_ * 1.0000004;
  auVar226._8_4_ = auVar101._8_4_ * 1.0000004;
  auVar226._12_4_ = auVar101._12_4_ * 1.0000004;
  auVar226._16_4_ = auVar101._16_4_ * 1.0000004;
  auVar226._20_4_ = auVar101._20_4_ * 1.0000004;
  auVar226._24_4_ = auVar101._24_4_ * 1.0000004;
  auVar226._28_4_ = auVar101._28_4_;
  auVar133[4] = PVar7;
  auVar133._5_3_ = 0;
  auVar133[8] = PVar7;
  auVar133._9_3_ = 0;
  auVar133[0xc] = PVar7;
  auVar133._13_3_ = 0;
  auVar133[0x10] = PVar7;
  auVar133._17_3_ = 0;
  auVar133[0x14] = PVar7;
  auVar133._21_3_ = 0;
  auVar133[0x18] = PVar7;
  auVar133._25_3_ = 0;
  auVar133[0x1c] = PVar7;
  auVar133._29_3_ = 0;
  auVar231 = vpcmpgtd_avx2(auVar133,_DAT_01fb4ba0);
  auVar101 = vcmpps_avx(local_3c0,auVar226,2);
  auVar101 = vandps_avx(auVar101,auVar231);
  uVar83 = vmovmskps_avx(auVar101);
  auVar101._16_16_ = mm_lookupmask_ps._240_16_;
  auVar101._0_16_ = mm_lookupmask_ps._240_16_;
  local_520 = vblendps_avx(auVar101,ZEXT832(0) << 0x20,0x80);
  local_918 = prim;
LAB_012c40ae:
  local_908 = (ulong)uVar83;
  if (local_908 == 0) {
LAB_012c66ba:
    return local_908 != 0;
  }
  lVar80 = 0;
  for (uVar79 = local_908; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
    lVar80 = lVar80 + 1;
  }
  local_910 = local_908 - 1 & local_908;
  local_7c0 = *(undefined4 *)(local_918 + lVar80 * 4 + 6);
  uVar79 = (ulong)(uint)((int)lVar80 << 6);
  auVar10 = *(undefined1 (*) [16])(local_920 + uVar79);
  if (local_910 != 0) {
    uVar84 = local_910 - 1 & local_910;
    for (uVar81 = local_910; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
    }
    if (uVar84 != 0) {
      for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar11 = *(undefined1 (*) [16])(local_920 + uVar79 + 0x10);
  auVar1 = *(undefined1 (*) [16])(local_920 + uVar79 + 0x20);
  auVar2 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar3 = vinsertps_avx(auVar2,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar89 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar249._4_4_ = uVar89;
  auVar249._0_4_ = uVar89;
  auVar249._8_4_ = uVar89;
  auVar249._12_4_ = uVar89;
  fStack_670 = (float)uVar89;
  _local_680 = auVar249;
  fStack_66c = (float)uVar89;
  fStack_668 = (float)uVar89;
  uStack_664 = uVar89;
  auVar2 = *(undefined1 (*) [16])(local_920 + uVar79 + 0x30);
  uVar89 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar260._4_4_ = uVar89;
  auVar260._0_4_ = uVar89;
  auVar260._8_4_ = uVar89;
  auVar260._12_4_ = uVar89;
  fStack_690 = (float)uVar89;
  _local_6a0 = auVar260;
  fStack_68c = (float)uVar89;
  fStack_688 = (float)uVar89;
  register0x0000151c = uVar89;
  auVar97 = vunpcklps_avx(auVar249,auVar260);
  fVar88 = *(float *)(ray + k * 4 + 0x60);
  auVar275._4_4_ = fVar88;
  auVar275._0_4_ = fVar88;
  auVar275._8_4_ = fVar88;
  auVar275._12_4_ = fVar88;
  fStack_6b0 = fVar88;
  _local_6c0 = auVar275;
  fStack_6ac = fVar88;
  fStack_6a8 = fVar88;
  uStack_6a4 = fVar88;
  local_970 = vinsertps_avx(auVar97,auVar275,0x28);
  auVar212._0_4_ = (auVar10._0_4_ + auVar11._0_4_ + auVar1._0_4_ + auVar2._0_4_) * 0.25;
  auVar212._4_4_ = (auVar10._4_4_ + auVar11._4_4_ + auVar1._4_4_ + auVar2._4_4_) * 0.25;
  auVar212._8_4_ = (auVar10._8_4_ + auVar11._8_4_ + auVar1._8_4_ + auVar2._8_4_) * 0.25;
  auVar212._12_4_ = (auVar10._12_4_ + auVar11._12_4_ + auVar1._12_4_ + auVar2._12_4_) * 0.25;
  auVar97 = vsubps_avx(auVar212,auVar3);
  auVar97 = vdpps_avx(auVar97,local_970,0x7f);
  local_980 = vdpps_avx(local_970,local_970,0x7f);
  uVar83 = *(uint *)(local_918 + 2);
  auVar4 = vrcpss_avx(local_980,local_980);
  auVar5 = vfnmadd213ss_fma(auVar4,local_980,ZEXT416(0x40000000));
  local_3a0 = auVar97._0_4_ * auVar4._0_4_ * auVar5._0_4_;
  auVar94._4_4_ = local_3a0;
  auVar94._0_4_ = local_3a0;
  auVar94._8_4_ = local_3a0;
  auVar94._12_4_ = local_3a0;
  fStack_8f0 = local_3a0;
  _local_900 = auVar94;
  fStack_8ec = local_3a0;
  fStack_8e8 = local_3a0;
  fStack_8e4 = local_3a0;
  auVar97 = vfmadd231ps_fma(auVar3,local_970,auVar94);
  auVar97 = vblendps_avx(auVar97,_DAT_01f45a50,8);
  auVar3 = vsubps_avx(auVar10,auVar97);
  auVar4 = vsubps_avx(auVar1,auVar97);
  auVar5 = vsubps_avx(auVar11,auVar97);
  auVar2 = vsubps_avx(auVar2,auVar97);
  auVar10 = vmovshdup_avx(auVar3);
  uVar90 = auVar10._0_8_;
  auVar203._8_8_ = uVar90;
  auVar203._0_8_ = uVar90;
  auVar203._16_8_ = uVar90;
  auVar203._24_8_ = uVar90;
  auVar10 = vshufps_avx(auVar3,auVar3,0xaa);
  uVar90 = auVar10._0_8_;
  auVar231._8_8_ = uVar90;
  auVar231._0_8_ = uVar90;
  auVar231._16_8_ = uVar90;
  auVar231._24_8_ = uVar90;
  auVar10 = vshufps_avx(auVar3,auVar3,0xff);
  uVar90 = auVar10._0_8_;
  local_340._8_8_ = uVar90;
  local_340._0_8_ = uVar90;
  local_340._16_8_ = uVar90;
  local_340._24_8_ = uVar90;
  auVar10 = vmovshdup_avx(auVar5);
  uVar90 = auVar10._0_8_;
  auVar245._8_8_ = uVar90;
  auVar245._0_8_ = uVar90;
  auVar245._16_8_ = uVar90;
  auVar245._24_8_ = uVar90;
  auVar248 = ZEXT3264(auVar245);
  auVar10 = vshufps_avx(auVar5,auVar5,0xaa);
  uVar90 = auVar10._0_8_;
  local_9c0._8_8_ = uVar90;
  local_9c0._0_8_ = uVar90;
  local_9c0._16_8_ = uVar90;
  local_9c0._24_8_ = uVar90;
  auVar267 = ZEXT3264(local_9c0);
  auVar11 = vshufps_avx(auVar5,auVar5,0xff);
  uVar90 = auVar11._0_8_;
  auVar271._8_8_ = uVar90;
  auVar271._0_8_ = uVar90;
  auVar271._16_8_ = uVar90;
  auVar271._24_8_ = uVar90;
  auVar10 = vmovshdup_avx(auVar4);
  local_1e0 = auVar10._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar10 = vshufps_avx(auVar4,auVar4,0xaa);
  local_4e0 = auVar10._0_4_;
  fStack_4dc = auVar10._4_4_;
  auVar10 = vshufps_avx(auVar4,auVar4,0xff);
  local_500 = auVar10._0_4_;
  fStack_4fc = auVar10._4_4_;
  auVar10 = vmovshdup_avx(auVar2);
  local_200 = auVar10._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar10 = vshufps_avx(auVar2,auVar2,0xaa);
  local_220 = auVar10._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar10 = vshufps_avx(auVar2,auVar2,0xff);
  local_240 = auVar10._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar10 = vfmadd231ps_fma(ZEXT432((uint)(fVar88 * fVar88)),_local_6a0,_local_6a0);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),_local_680,_local_680);
  uVar89 = auVar10._0_4_;
  local_260._4_4_ = uVar89;
  local_260._0_4_ = uVar89;
  local_260._8_4_ = uVar89;
  local_260._12_4_ = uVar89;
  local_260._16_4_ = uVar89;
  local_260._20_4_ = uVar89;
  local_260._24_4_ = uVar89;
  local_260._28_4_ = uVar89;
  auVar253 = ZEXT3264(local_260);
  fVar88 = *(float *)(ray + k * 4 + 0x30);
  local_940 = ZEXT416((uint)local_3a0);
  local_3a0 = fVar88 - local_3a0;
  fStack_39c = local_3a0;
  fStack_398 = local_3a0;
  fStack_394 = local_3a0;
  fStack_390 = local_3a0;
  fStack_38c = local_3a0;
  fStack_388 = local_3a0;
  fStack_384 = local_3a0;
  uVar79 = 0;
  bVar85 = 0;
  local_c0c = 1;
  uVar89 = auVar3._0_4_;
  local_360._4_4_ = uVar89;
  local_360._0_4_ = uVar89;
  local_360._8_4_ = uVar89;
  local_360._12_4_ = uVar89;
  local_360._16_4_ = uVar89;
  local_360._20_4_ = uVar89;
  local_360._24_4_ = uVar89;
  local_360._28_4_ = uVar89;
  fVar118 = auVar5._0_4_;
  local_380._4_4_ = fVar118;
  local_380._0_4_ = fVar118;
  local_380._8_4_ = fVar118;
  local_380._12_4_ = fVar118;
  local_380._16_4_ = fVar118;
  local_380._20_4_ = fVar118;
  local_380._24_4_ = fVar118;
  local_380._28_4_ = fVar118;
  fVar141 = auVar4._0_4_;
  local_280 = fVar141;
  fStack_27c = fVar141;
  fStack_278 = fVar141;
  fStack_274 = fVar141;
  fStack_270 = fVar141;
  fStack_26c = fVar141;
  fStack_268 = fVar141;
  fStack_264 = fVar141;
  fVar172 = auVar2._0_4_;
  local_2a0 = fVar172;
  fStack_29c = fVar172;
  fStack_298 = fVar172;
  fStack_294 = fVar172;
  fStack_290 = fVar172;
  fStack_28c = fVar172;
  fStack_288 = fVar172;
  fStack_284 = fVar172;
  local_5a0 = vandps_avx(local_260,local_6e0);
  auVar10 = vsqrtss_avx(local_980,local_980);
  auVar1 = vsqrtss_avx(local_980,local_980);
  local_5b0 = ZEXT816(0x3f80000000000000);
  uStack_7bc = local_7c0;
  uStack_7b8 = local_7c0;
  uStack_7b4 = local_7c0;
  local_7b0 = uVar83;
  uStack_7ac = uVar83;
  uStack_7a8 = uVar83;
  uStack_7a4 = uVar83;
  local_580 = auVar245;
  local_560 = auVar231;
  local_540 = auVar203;
  fStack_4f8 = local_500;
  fStack_4f4 = fStack_4fc;
  fStack_4f0 = local_500;
  fStack_4ec = fStack_4fc;
  fStack_4e8 = local_500;
  fStack_4e4 = fStack_4fc;
  fStack_4d8 = local_4e0;
  fStack_4d4 = fStack_4dc;
  fStack_4d0 = local_4e0;
  fStack_4cc = fStack_4dc;
  fStack_4c8 = local_4e0;
  fStack_4c4 = fStack_4dc;
  do {
    auVar184._8_4_ = 0x3f800000;
    auVar184._0_8_ = 0x3f8000003f800000;
    auVar184._12_4_ = 0x3f800000;
    auVar184._16_4_ = 0x3f800000;
    auVar184._20_4_ = 0x3f800000;
    auVar184._24_4_ = 0x3f800000;
    auVar184._28_4_ = 0x3f800000;
    auVar97 = vmovshdup_avx(local_5b0);
    auVar97 = vsubps_avx(auVar97,local_5b0);
    fVar164 = auVar97._0_4_;
    fVar169 = fVar164 * 0.04761905;
    local_a00._0_4_ = local_5b0._0_4_;
    local_a00._4_4_ = local_a00._0_4_;
    local_a00._8_4_ = local_a00._0_4_;
    local_a00._12_4_ = local_a00._0_4_;
    local_a00._16_4_ = local_a00._0_4_;
    local_a00._20_4_ = local_a00._0_4_;
    local_a00._24_4_ = local_a00._0_4_;
    local_a00._28_4_ = local_a00._0_4_;
    local_a20._4_4_ = fVar164;
    local_a20._0_4_ = fVar164;
    local_a20._8_4_ = fVar164;
    local_a20._12_4_ = fVar164;
    local_a20._16_4_ = fVar164;
    local_a20._20_4_ = fVar164;
    local_a20._24_4_ = fVar164;
    local_a20._28_4_ = fVar164;
    auVar97 = vfmadd231ps_fma(local_a00,local_a20,_DAT_01f7b040);
    auVar101 = vsubps_avx(auVar184,ZEXT1632(auVar97));
    fVar143 = auVar97._0_4_;
    auVar254._0_4_ = local_380._0_4_ * fVar143;
    fVar160 = auVar97._4_4_;
    auVar254._4_4_ = local_380._4_4_ * fVar160;
    fVar142 = auVar97._8_4_;
    auVar254._8_4_ = local_380._8_4_ * fVar142;
    fVar162 = auVar97._12_4_;
    auVar254._12_4_ = local_380._12_4_ * fVar162;
    auVar254._16_4_ = local_380._16_4_ * 0.0;
    auVar254._20_4_ = local_380._20_4_ * 0.0;
    auVar254._28_36_ = auVar253._28_36_;
    auVar254._24_4_ = local_380._24_4_ * 0.0;
    auVar244._0_4_ = auVar245._0_4_ * fVar143;
    auVar244._4_4_ = auVar245._4_4_ * fVar160;
    auVar244._8_4_ = auVar245._8_4_ * fVar142;
    auVar244._12_4_ = auVar245._12_4_ * fVar162;
    auVar244._16_4_ = auVar245._16_4_ * 0.0;
    auVar244._20_4_ = auVar245._20_4_ * 0.0;
    auVar244._28_36_ = auVar248._28_36_;
    auVar244._24_4_ = auVar245._24_4_ * 0.0;
    auVar19._4_4_ = auVar267._4_4_ * fVar160;
    auVar19._0_4_ = auVar267._0_4_ * fVar143;
    auVar19._8_4_ = auVar267._8_4_ * fVar142;
    auVar19._12_4_ = auVar267._12_4_ * fVar162;
    auVar19._16_4_ = auVar267._16_4_ * 0.0;
    auVar19._20_4_ = auVar267._20_4_ * 0.0;
    auVar19._24_4_ = auVar267._24_4_ * 0.0;
    auVar19._28_4_ = auVar245._28_4_;
    fVar166 = auVar11._0_4_;
    fVar168 = auVar11._4_4_;
    auVar20._4_4_ = fVar168 * fVar160;
    auVar20._0_4_ = fVar166 * fVar143;
    auVar20._8_4_ = fVar166 * fVar142;
    auVar20._12_4_ = fVar168 * fVar162;
    auVar20._16_4_ = fVar166 * 0.0;
    auVar20._20_4_ = fVar168 * 0.0;
    auVar20._24_4_ = fVar166 * 0.0;
    auVar20._28_4_ = fVar164;
    auVar97 = vfmadd231ps_fma(auVar254._0_32_,auVar101,local_360);
    auVar6 = vfmadd231ps_fma(auVar244._0_32_,auVar101,auVar203);
    auVar91 = vfmadd231ps_fma(auVar19,auVar101,auVar231);
    auVar211 = vfmadd231ps_fma(auVar20,auVar101,local_340);
    auVar74._4_4_ = fStack_27c;
    auVar74._0_4_ = local_280;
    auVar74._8_4_ = fStack_278;
    auVar74._12_4_ = fStack_274;
    auVar74._16_4_ = fStack_270;
    auVar74._20_4_ = fStack_26c;
    auVar74._24_4_ = fStack_268;
    auVar74._28_4_ = fStack_264;
    auVar21._4_4_ = fStack_27c * fVar160;
    auVar21._0_4_ = local_280 * fVar143;
    auVar21._8_4_ = fStack_278 * fVar142;
    auVar21._12_4_ = fStack_274 * fVar162;
    auVar21._16_4_ = fStack_270 * 0.0;
    auVar21._20_4_ = fStack_26c * 0.0;
    auVar21._24_4_ = fStack_268 * 0.0;
    auVar21._28_4_ = local_340._28_4_;
    auVar75._8_8_ = uStack_1d8;
    auVar75._0_8_ = local_1e0;
    auVar75._16_8_ = uStack_1d0;
    auVar75._24_8_ = uStack_1c8;
    auVar22._4_4_ = (float)((ulong)local_1e0 >> 0x20) * fVar160;
    auVar22._0_4_ = (float)local_1e0 * fVar143;
    auVar22._8_4_ = (float)uStack_1d8 * fVar142;
    auVar22._12_4_ = (float)((ulong)uStack_1d8 >> 0x20) * fVar162;
    auVar22._16_4_ = (float)uStack_1d0 * 0.0;
    auVar22._20_4_ = (float)((ulong)uStack_1d0 >> 0x20) * 0.0;
    auVar22._24_4_ = (float)uStack_1c8 * 0.0;
    auVar22._28_4_ = auVar231._28_4_;
    auVar76._4_4_ = fVar160 * fStack_4dc;
    auVar76._0_4_ = fVar143 * local_4e0;
    auVar76._8_4_ = fVar142 * fStack_4d8;
    auVar76._12_4_ = fVar162 * fStack_4d4;
    auVar76._16_4_ = fStack_4d0 * 0.0;
    auVar76._20_4_ = fStack_4cc * 0.0;
    auVar76._24_4_ = fStack_4c8 * 0.0;
    auVar76._28_4_ = DAT_01f7b040._28_4_;
    auVar23._4_4_ = fVar160 * fStack_4fc;
    auVar23._0_4_ = fVar143 * local_500;
    auVar23._8_4_ = fVar142 * fStack_4f8;
    auVar23._12_4_ = fVar162 * fStack_4f4;
    auVar23._16_4_ = fStack_4f0 * 0.0;
    auVar23._20_4_ = fStack_4ec * 0.0;
    auVar23._24_4_ = fStack_4e8 * 0.0;
    auVar23._28_4_ = 0x3f800000;
    auVar212 = vfmadd231ps_fma(auVar21,auVar101,local_380);
    auVar94 = vfmadd231ps_fma(auVar22,auVar101,auVar245);
    auVar249 = vfmadd231ps_fma(auVar76,auVar101,auVar267._0_32_);
    auVar260 = vfmadd231ps_fma(auVar23,auVar101,auVar271);
    auVar268._0_4_ = fVar143 * local_2a0;
    auVar268._4_4_ = fVar160 * fStack_29c;
    auVar268._8_4_ = fVar142 * fStack_298;
    auVar268._12_4_ = fVar162 * fStack_294;
    auVar268._16_4_ = fStack_290 * 0.0;
    auVar268._20_4_ = fStack_28c * 0.0;
    auVar268._28_36_ = auVar267._28_36_;
    auVar268._24_4_ = fStack_288 * 0.0;
    auVar24._4_4_ = fVar160 * local_200._4_4_;
    auVar24._0_4_ = fVar143 * (float)local_200;
    auVar24._8_4_ = fVar142 * (float)uStack_1f8;
    auVar24._12_4_ = fVar162 * uStack_1f8._4_4_;
    auVar24._16_4_ = (float)uStack_1f0 * 0.0;
    auVar24._20_4_ = uStack_1f0._4_4_ * 0.0;
    auVar24._24_4_ = (float)uStack_1e8 * 0.0;
    auVar24._28_4_ = auVar245._28_4_;
    auVar25._28_4_ = auVar203._28_4_;
    auVar25._0_28_ =
         ZEXT1628(CONCAT412(auVar212._12_4_ * fVar162,
                            CONCAT48(auVar212._8_4_ * fVar142,
                                     CONCAT44(auVar212._4_4_ * fVar160,auVar212._0_4_ * fVar143))));
    auVar97 = vfmadd231ps_fma(auVar25,auVar101,ZEXT1632(auVar97));
    auVar6 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar162 * auVar94._12_4_,
                                                CONCAT48(fVar142 * auVar94._8_4_,
                                                         CONCAT44(fVar160 * auVar94._4_4_,
                                                                  fVar143 * auVar94._0_4_)))),
                             auVar101,ZEXT1632(auVar6));
    auVar91 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar162 * auVar249._12_4_,
                                                 CONCAT48(fVar142 * auVar249._8_4_,
                                                          CONCAT44(fVar160 * auVar249._4_4_,
                                                                   fVar143 * auVar249._0_4_)))),
                              auVar101,ZEXT1632(auVar91));
    auVar211 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar162 * auVar260._12_4_,
                                                  CONCAT48(fVar142 * auVar260._8_4_,
                                                           CONCAT44(fVar160 * auVar260._4_4_,
                                                                    fVar143 * auVar260._0_4_)))),
                               auVar101,ZEXT1632(auVar211));
    auVar26._4_4_ = fVar160 * local_220._4_4_;
    auVar26._0_4_ = fVar143 * (float)local_220;
    auVar26._8_4_ = fVar142 * (float)uStack_218;
    auVar26._12_4_ = fVar162 * uStack_218._4_4_;
    auVar26._16_4_ = (float)uStack_210 * 0.0;
    auVar26._20_4_ = uStack_210._4_4_ * 0.0;
    auVar26._24_4_ = (float)uStack_208 * 0.0;
    auVar26._28_4_ = local_380._28_4_;
    auVar275 = vfmadd231ps_fma(auVar268._0_32_,auVar101,auVar74);
    auVar212 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar275._12_4_ * fVar162,
                                                  CONCAT48(auVar275._8_4_ * fVar142,
                                                           CONCAT44(auVar275._4_4_ * fVar160,
                                                                    auVar275._0_4_ * fVar143)))),
                               auVar101,ZEXT1632(auVar212));
    auVar239._0_4_ = fVar143 * (float)local_240;
    auVar239._4_4_ = fVar160 * local_240._4_4_;
    auVar239._8_4_ = fVar142 * (float)uStack_238;
    auVar239._12_4_ = fVar162 * uStack_238._4_4_;
    auVar239._16_4_ = (float)uStack_230 * 0.0;
    auVar239._20_4_ = uStack_230._4_4_ * 0.0;
    auVar239._24_4_ = (float)uStack_228 * 0.0;
    auVar239._28_4_ = 0;
    auVar275 = vfmadd231ps_fma(auVar24,auVar101,auVar75);
    auVar70._4_4_ = fStack_4dc;
    auVar70._0_4_ = local_4e0;
    auVar70._8_4_ = fStack_4d8;
    auVar70._12_4_ = fStack_4d4;
    auVar70._16_4_ = fStack_4d0;
    auVar70._20_4_ = fStack_4cc;
    auVar70._24_4_ = fStack_4c8;
    auVar70._28_4_ = fStack_4c4;
    auVar98 = vfmadd231ps_fma(auVar26,auVar101,auVar70);
    auVar69._4_4_ = fStack_4fc;
    auVar69._0_4_ = local_500;
    auVar69._8_4_ = fStack_4f8;
    auVar69._12_4_ = fStack_4f4;
    auVar69._16_4_ = fStack_4f0;
    auVar69._20_4_ = fStack_4ec;
    auVar69._24_4_ = fStack_4e8;
    auVar69._28_4_ = fStack_4e4;
    auVar126 = vfmadd231ps_fma(auVar239,auVar101,auVar69);
    auVar77._28_4_ = fVar168;
    auVar77._0_28_ =
         ZEXT1628(CONCAT412(auVar126._12_4_ * fVar162,
                            CONCAT48(auVar126._8_4_ * fVar142,
                                     CONCAT44(auVar126._4_4_ * fVar160,auVar126._0_4_ * fVar143))));
    auVar94 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar275._12_4_ * fVar162,
                                                 CONCAT48(auVar275._8_4_ * fVar142,
                                                          CONCAT44(auVar275._4_4_ * fVar160,
                                                                   auVar275._0_4_ * fVar143)))),
                              auVar101,ZEXT1632(auVar94));
    auVar249 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar162 * auVar98._12_4_,
                                                  CONCAT48(fVar142 * auVar98._8_4_,
                                                           CONCAT44(fVar160 * auVar98._4_4_,
                                                                    fVar143 * auVar98._0_4_)))),
                               auVar101,ZEXT1632(auVar249));
    auVar260 = vfmadd231ps_fma(auVar77,auVar101,ZEXT1632(auVar260));
    auVar27._28_4_ = fStack_264;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(auVar94._12_4_ * fVar162,
                            CONCAT48(auVar94._8_4_ * fVar142,
                                     CONCAT44(auVar94._4_4_ * fVar160,auVar94._0_4_ * fVar143))));
    auVar28._28_4_ = (int)((ulong)uStack_1c8 >> 0x20);
    auVar28._0_28_ =
         ZEXT1628(CONCAT412(fVar162 * auVar249._12_4_,
                            CONCAT48(fVar142 * auVar249._8_4_,
                                     CONCAT44(fVar160 * auVar249._4_4_,fVar143 * auVar249._0_4_))));
    auVar275 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar212._12_4_ * fVar162,
                                                  CONCAT48(auVar212._8_4_ * fVar142,
                                                           CONCAT44(auVar212._4_4_ * fVar160,
                                                                    auVar212._0_4_ * fVar143)))),
                               auVar101,ZEXT1632(auVar97));
    auVar98 = vfmadd231ps_fma(auVar27,auVar101,ZEXT1632(auVar6));
    auVar102 = ZEXT1632(auVar98);
    auVar98 = vfmadd231ps_fma(auVar28,auVar101,ZEXT1632(auVar91));
    auVar126 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar260._12_4_ * fVar162,
                                                  CONCAT48(auVar260._8_4_ * fVar142,
                                                           CONCAT44(auVar260._4_4_ * fVar160,
                                                                    auVar260._0_4_ * fVar143)))),
                               ZEXT1632(auVar211),auVar101);
    auVar101 = vsubps_avx(ZEXT1632(auVar212),ZEXT1632(auVar97));
    auVar231 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar6));
    auVar12 = vsubps_avx(ZEXT1632(auVar249),ZEXT1632(auVar91));
    auVar13 = vsubps_avx(ZEXT1632(auVar260),ZEXT1632(auVar211));
    local_7e0._0_4_ = fVar169 * auVar101._0_4_ * 3.0;
    local_7e0._4_4_ = fVar169 * auVar101._4_4_ * 3.0;
    local_7e0._8_4_ = fVar169 * auVar101._8_4_ * 3.0;
    local_7e0._12_4_ = fVar169 * auVar101._12_4_ * 3.0;
    local_7e0._16_4_ = fVar169 * auVar101._16_4_ * 3.0;
    local_7e0._20_4_ = fVar169 * auVar101._20_4_ * 3.0;
    local_7e0._24_4_ = fVar169 * auVar101._24_4_ * 3.0;
    local_7e0._28_4_ = 0;
    auVar246._0_4_ = fVar169 * auVar231._0_4_ * 3.0;
    auVar246._4_4_ = fVar169 * auVar231._4_4_ * 3.0;
    auVar246._8_4_ = fVar169 * auVar231._8_4_ * 3.0;
    auVar246._12_4_ = fVar169 * auVar231._12_4_ * 3.0;
    auVar246._16_4_ = fVar169 * auVar231._16_4_ * 3.0;
    auVar246._20_4_ = fVar169 * auVar231._20_4_ * 3.0;
    auVar246._24_4_ = fVar169 * auVar231._24_4_ * 3.0;
    auVar246._28_4_ = 0;
    auVar262._0_4_ = fVar169 * auVar12._0_4_ * 3.0;
    auVar262._4_4_ = fVar169 * auVar12._4_4_ * 3.0;
    auVar262._8_4_ = fVar169 * auVar12._8_4_ * 3.0;
    auVar262._12_4_ = fVar169 * auVar12._12_4_ * 3.0;
    auVar262._16_4_ = fVar169 * auVar12._16_4_ * 3.0;
    auVar262._20_4_ = fVar169 * auVar12._20_4_ * 3.0;
    auVar262._24_4_ = fVar169 * auVar12._24_4_ * 3.0;
    auVar262._28_4_ = 0;
    fVar142 = fVar169 * auVar13._0_4_ * 3.0;
    fVar159 = fVar169 * auVar13._4_4_ * 3.0;
    auVar29._4_4_ = fVar159;
    auVar29._0_4_ = fVar142;
    fVar161 = fVar169 * auVar13._8_4_ * 3.0;
    auVar29._8_4_ = fVar161;
    fVar163 = fVar169 * auVar13._12_4_ * 3.0;
    auVar29._12_4_ = fVar163;
    fVar165 = fVar169 * auVar13._16_4_ * 3.0;
    auVar29._16_4_ = fVar165;
    fVar167 = fVar169 * auVar13._20_4_ * 3.0;
    auVar29._20_4_ = fVar167;
    fVar169 = fVar169 * auVar13._24_4_ * 3.0;
    auVar29._24_4_ = fVar169;
    auVar29._28_4_ = auVar231._28_4_;
    auVar185 = ZEXT1632(auVar275);
    auVar226 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar275));
    _local_960 = vpermps_avx2(_DAT_01fb7720,auVar102);
    auVar133 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar98));
    auVar13 = vsubps_avx(auVar226,auVar185);
    auVar14 = vsubps_avx(auVar133,ZEXT1632(auVar98));
    fVar143 = auVar14._0_4_;
    fVar162 = auVar14._4_4_;
    auVar30._4_4_ = local_7e0._4_4_ * fVar162;
    auVar30._0_4_ = local_7e0._0_4_ * fVar143;
    fVar166 = auVar14._8_4_;
    auVar30._8_4_ = local_7e0._8_4_ * fVar166;
    fVar170 = auVar14._12_4_;
    auVar30._12_4_ = local_7e0._12_4_ * fVar170;
    fVar173 = auVar14._16_4_;
    auVar30._16_4_ = local_7e0._16_4_ * fVar173;
    fVar194 = auVar14._20_4_;
    auVar30._20_4_ = local_7e0._20_4_ * fVar194;
    fVar269 = auVar14._24_4_;
    auVar30._24_4_ = local_7e0._24_4_ * fVar269;
    auVar30._28_4_ = auVar133._28_4_;
    auVar97 = vfmsub231ps_fma(auVar30,auVar262,auVar13);
    local_2c0 = vsubps_avx(_local_960,auVar102);
    fVar160 = auVar13._0_4_;
    fVar164 = auVar13._4_4_;
    auVar31._4_4_ = auVar246._4_4_ * fVar164;
    auVar31._0_4_ = auVar246._0_4_ * fVar160;
    fVar168 = auVar13._8_4_;
    auVar31._8_4_ = auVar246._8_4_ * fVar168;
    fVar171 = auVar13._12_4_;
    auVar31._12_4_ = auVar246._12_4_ * fVar171;
    fVar278 = auVar13._16_4_;
    auVar31._16_4_ = auVar246._16_4_ * fVar278;
    fVar279 = auVar13._20_4_;
    auVar31._20_4_ = auVar246._20_4_ * fVar279;
    fVar270 = auVar13._24_4_;
    auVar31._24_4_ = auVar246._24_4_ * fVar270;
    auVar31._28_4_ = local_960._28_4_;
    auVar6 = vfmsub231ps_fma(auVar31,local_7e0,local_2c0);
    auVar97 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar6._12_4_ * auVar6._12_4_,
                                                 CONCAT48(auVar6._8_4_ * auVar6._8_4_,
                                                          CONCAT44(auVar6._4_4_ * auVar6._4_4_,
                                                                   auVar6._0_4_ * auVar6._0_4_)))),
                              ZEXT1632(auVar97),ZEXT1632(auVar97));
    fVar195 = local_2c0._0_4_;
    auVar186._0_4_ = fVar195 * auVar262._0_4_;
    fVar196 = local_2c0._4_4_;
    auVar186._4_4_ = fVar196 * auVar262._4_4_;
    fVar255 = local_2c0._8_4_;
    auVar186._8_4_ = fVar255 * auVar262._8_4_;
    fVar256 = local_2c0._12_4_;
    auVar186._12_4_ = fVar256 * auVar262._12_4_;
    fVar257 = local_2c0._16_4_;
    auVar186._16_4_ = fVar257 * auVar262._16_4_;
    fVar258 = local_2c0._20_4_;
    auVar186._20_4_ = fVar258 * auVar262._20_4_;
    fVar259 = local_2c0._24_4_;
    auVar186._24_4_ = fVar259 * auVar262._24_4_;
    auVar186._28_4_ = 0;
    auVar6 = vfmsub231ps_fma(auVar186,auVar246,auVar14);
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar97),ZEXT1632(auVar6),ZEXT1632(auVar6));
    auVar187._0_4_ = fVar143 * fVar143;
    auVar187._4_4_ = fVar162 * fVar162;
    auVar187._8_4_ = fVar166 * fVar166;
    auVar187._12_4_ = fVar170 * fVar170;
    auVar187._16_4_ = fVar173 * fVar173;
    auVar187._20_4_ = fVar194 * fVar194;
    auVar187._24_4_ = fVar269 * fVar269;
    auVar187._28_4_ = 0;
    auVar97 = vfmadd231ps_fma(auVar187,local_2c0,local_2c0);
    auVar91 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar13,auVar13);
    auVar101 = vrcpps_avx(ZEXT1632(auVar91));
    auVar266._8_4_ = 0x3f800000;
    auVar266._0_8_ = 0x3f8000003f800000;
    auVar266._12_4_ = 0x3f800000;
    auVar266._16_4_ = 0x3f800000;
    auVar266._20_4_ = 0x3f800000;
    auVar266._24_4_ = 0x3f800000;
    auVar266._28_4_ = 0x3f800000;
    auVar97 = vfnmadd213ps_fma(auVar101,ZEXT1632(auVar91),auVar266);
    auVar97 = vfmadd132ps_fma(ZEXT1632(auVar97),auVar101,auVar101);
    local_9a0 = vpermps_avx2(_DAT_01fb7720,local_7e0);
    local_800 = vpermps_avx2(_DAT_01fb7720,auVar262);
    auVar32._4_4_ = local_9a0._4_4_ * fVar162;
    auVar32._0_4_ = local_9a0._0_4_ * fVar143;
    auVar32._8_4_ = local_9a0._8_4_ * fVar166;
    auVar32._12_4_ = local_9a0._12_4_ * fVar170;
    auVar32._16_4_ = local_9a0._16_4_ * fVar173;
    auVar32._20_4_ = local_9a0._20_4_ * fVar194;
    auVar32._24_4_ = local_9a0._24_4_ * fVar269;
    auVar32._28_4_ = auVar101._28_4_;
    auVar211 = vfmsub231ps_fma(auVar32,local_800,auVar13);
    local_9e0 = vpermps_avx2(_DAT_01fb7720,auVar246);
    auVar33._4_4_ = local_9e0._4_4_ * fVar164;
    auVar33._0_4_ = local_9e0._0_4_ * fVar160;
    auVar33._8_4_ = local_9e0._8_4_ * fVar168;
    auVar33._12_4_ = local_9e0._12_4_ * fVar171;
    auVar33._16_4_ = local_9e0._16_4_ * fVar278;
    auVar33._20_4_ = local_9e0._20_4_ * fVar279;
    auVar33._24_4_ = local_9e0._24_4_ * fVar270;
    auVar33._28_4_ = 0;
    auVar212 = vfmsub231ps_fma(auVar33,local_9a0,local_2c0);
    auVar211 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar212._12_4_ * auVar212._12_4_,
                                                  CONCAT48(auVar212._8_4_ * auVar212._8_4_,
                                                           CONCAT44(auVar212._4_4_ * auVar212._4_4_,
                                                                    auVar212._0_4_ * auVar212._0_4_)
                                                          ))),ZEXT1632(auVar211),ZEXT1632(auVar211))
    ;
    auVar217._0_4_ = fVar195 * local_800._0_4_;
    auVar217._4_4_ = fVar196 * local_800._4_4_;
    auVar217._8_4_ = fVar255 * local_800._8_4_;
    auVar217._12_4_ = fVar256 * local_800._12_4_;
    auVar217._16_4_ = fVar257 * local_800._16_4_;
    auVar217._20_4_ = fVar258 * local_800._20_4_;
    auVar217._24_4_ = fVar259 * local_800._24_4_;
    auVar217._28_4_ = 0;
    auVar212 = vfmsub231ps_fma(auVar217,local_9e0,auVar14);
    auVar211 = vfmadd231ps_fma(ZEXT1632(auVar211),ZEXT1632(auVar212),ZEXT1632(auVar212));
    auVar101 = vmaxps_avx(ZEXT1632(CONCAT412(auVar6._12_4_ * auVar97._12_4_,
                                             CONCAT48(auVar6._8_4_ * auVar97._8_4_,
                                                      CONCAT44(auVar6._4_4_ * auVar97._4_4_,
                                                               auVar6._0_4_ * auVar97._0_4_)))),
                          ZEXT1632(CONCAT412(auVar211._12_4_ * auVar97._12_4_,
                                             CONCAT48(auVar211._8_4_ * auVar97._8_4_,
                                                      CONCAT44(auVar211._4_4_ * auVar97._4_4_,
                                                               auVar211._0_4_ * auVar97._0_4_)))));
    local_840._0_4_ = auVar126._0_4_ + fVar142;
    local_840._4_4_ = auVar126._4_4_ + fVar159;
    local_840._8_4_ = auVar126._8_4_ + fVar161;
    local_840._12_4_ = auVar126._12_4_ + fVar163;
    local_840._16_4_ = fVar165 + 0.0;
    local_840._20_4_ = fVar167 + 0.0;
    local_840._24_4_ = fVar169 + 0.0;
    local_840._28_4_ = auVar231._28_4_ + 0.0;
    local_820 = ZEXT1632(auVar126);
    auVar231 = vsubps_avx(local_820,auVar29);
    local_860 = vpermps_avx2(_DAT_01fb7720,auVar231);
    local_880 = vpermps_avx2(_DAT_01fb7720,local_820);
    auVar231 = vmaxps_avx(local_820,local_840);
    auVar12 = vmaxps_avx(local_860,local_880);
    auVar231 = vmaxps_avx(auVar231,auVar12);
    auVar12 = vrsqrtps_avx(ZEXT1632(auVar91));
    fVar142 = auVar12._0_4_;
    fVar169 = auVar12._4_4_;
    fVar159 = auVar12._8_4_;
    fVar161 = auVar12._12_4_;
    fVar163 = auVar12._16_4_;
    fVar165 = auVar12._20_4_;
    fVar167 = auVar12._24_4_;
    uVar89 = local_860._28_4_;
    auVar34._4_4_ = fVar169 * fVar169 * fVar169 * auVar91._4_4_ * -0.5;
    auVar34._0_4_ = fVar142 * fVar142 * fVar142 * auVar91._0_4_ * -0.5;
    auVar34._8_4_ = fVar159 * fVar159 * fVar159 * auVar91._8_4_ * -0.5;
    auVar34._12_4_ = fVar161 * fVar161 * fVar161 * auVar91._12_4_ * -0.5;
    auVar34._16_4_ = fVar163 * fVar163 * fVar163 * -0.0;
    auVar34._20_4_ = fVar165 * fVar165 * fVar165 * -0.0;
    auVar34._24_4_ = fVar167 * fVar167 * fVar167 * -0.0;
    auVar34._28_4_ = local_9e0._28_4_;
    auVar103._8_4_ = 0x3fc00000;
    auVar103._0_8_ = 0x3fc000003fc00000;
    auVar103._12_4_ = 0x3fc00000;
    auVar103._16_4_ = 0x3fc00000;
    auVar103._20_4_ = 0x3fc00000;
    auVar103._24_4_ = 0x3fc00000;
    auVar103._28_4_ = 0x3fc00000;
    auVar97 = vfmadd231ps_fma(auVar34,auVar103,auVar12);
    auVar248 = ZEXT1664(auVar97);
    fVar142 = auVar97._0_4_;
    fVar169 = auVar97._4_4_;
    auVar35._4_4_ = fVar196 * fVar169;
    auVar35._0_4_ = fVar195 * fVar142;
    fVar159 = auVar97._8_4_;
    auVar35._8_4_ = fVar255 * fVar159;
    fVar161 = auVar97._12_4_;
    auVar35._12_4_ = fVar256 * fVar161;
    auVar35._16_4_ = fVar257 * 0.0;
    auVar35._20_4_ = fVar258 * 0.0;
    auVar35._24_4_ = fVar259 * 0.0;
    auVar35._28_4_ = 0;
    auVar36._4_4_ = (float)local_6c0._4_4_ * fVar169 * fVar162;
    auVar36._0_4_ = (float)local_6c0._0_4_ * fVar142 * fVar143;
    auVar36._8_4_ = fStack_6b8 * fVar159 * fVar166;
    auVar36._12_4_ = fStack_6b4 * fVar161 * fVar170;
    auVar36._16_4_ = fStack_6b0 * fVar173 * 0.0;
    auVar36._20_4_ = fStack_6ac * fVar194 * 0.0;
    auVar36._24_4_ = fStack_6a8 * fVar269 * 0.0;
    auVar36._28_4_ = local_9a0._28_4_;
    auVar6 = vfmadd231ps_fma(auVar36,auVar35,_local_6a0);
    auVar230 = ZEXT1632(auVar98);
    auVar12 = vsubps_avx(ZEXT832(0) << 0x20,auVar230);
    fVar163 = auVar12._0_4_;
    fVar165 = auVar12._4_4_;
    auVar37._4_4_ = fVar165 * fVar169 * fVar162;
    auVar37._0_4_ = fVar163 * fVar142 * fVar143;
    fVar167 = auVar12._8_4_;
    auVar37._8_4_ = fVar167 * fVar159 * fVar166;
    fVar195 = auVar12._12_4_;
    auVar37._12_4_ = fVar195 * fVar161 * fVar170;
    fVar196 = auVar12._16_4_;
    auVar37._16_4_ = fVar196 * fVar173 * 0.0;
    fVar173 = auVar12._20_4_;
    auVar37._20_4_ = fVar173 * fVar194 * 0.0;
    fVar194 = auVar12._24_4_;
    auVar37._24_4_ = fVar194 * fVar269 * 0.0;
    auVar37._28_4_ = local_800._28_4_;
    auVar15 = vsubps_avx(ZEXT832(0) << 0x20,auVar102);
    auVar91 = vfmadd231ps_fma(auVar37,auVar15,auVar35);
    auVar38._4_4_ = fVar169 * fVar164;
    auVar38._0_4_ = fVar142 * fVar160;
    auVar38._8_4_ = fVar159 * fVar168;
    auVar38._12_4_ = fVar161 * fVar171;
    auVar38._16_4_ = fVar278 * 0.0;
    auVar38._20_4_ = fVar279 * 0.0;
    auVar38._24_4_ = fVar270 * 0.0;
    auVar38._28_4_ = uVar89;
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar38,_local_680);
    auVar205 = ZEXT832(0) << 0x20;
    auVar16 = vsubps_avx(auVar205,auVar185);
    auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar16,auVar38);
    auVar12 = vsqrtps_avx(auVar101);
    auVar39._4_4_ = (float)local_6c0._4_4_ * fVar165;
    auVar39._0_4_ = (float)local_6c0._0_4_ * fVar163;
    auVar39._8_4_ = fStack_6b8 * fVar167;
    auVar39._12_4_ = fStack_6b4 * fVar195;
    auVar39._16_4_ = fStack_6b0 * fVar196;
    auVar39._20_4_ = fStack_6ac * fVar173;
    auVar39._24_4_ = fStack_6a8 * fVar194;
    auVar39._28_4_ = auVar101._28_4_;
    auVar211 = vfmadd231ps_fma(auVar39,_local_6a0,auVar15);
    auVar211 = vfmadd231ps_fma(ZEXT1632(auVar211),_local_680,auVar16);
    fVar143 = auVar91._0_4_;
    fVar278 = auVar6._0_4_;
    fVar160 = auVar91._4_4_;
    fVar279 = auVar6._4_4_;
    fVar162 = auVar91._8_4_;
    fVar269 = auVar6._8_4_;
    fVar164 = auVar91._12_4_;
    fVar270 = auVar6._12_4_;
    auVar40._28_4_ = uVar89;
    auVar40._0_28_ =
         ZEXT1628(CONCAT412(fVar270 * fVar164,
                            CONCAT48(fVar269 * fVar162,CONCAT44(fVar279 * fVar160,fVar278 * fVar143)
                                    )));
    auVar101 = vsubps_avx(ZEXT1632(auVar211),auVar40);
    auVar41._4_4_ = fVar165 * fVar165;
    auVar41._0_4_ = fVar163 * fVar163;
    auVar41._8_4_ = fVar167 * fVar167;
    auVar41._12_4_ = fVar195 * fVar195;
    auVar41._16_4_ = fVar196 * fVar196;
    auVar41._20_4_ = fVar173 * fVar173;
    auVar41._24_4_ = fVar194 * fVar194;
    auVar41._28_4_ = uVar89;
    auVar211 = vfmadd231ps_fma(auVar41,auVar15,auVar15);
    auVar211 = vfmadd231ps_fma(ZEXT1632(auVar211),auVar16,auVar16);
    auVar42._28_4_ = uStack_6a4;
    auVar42._0_28_ =
         ZEXT1628(CONCAT412(fVar164 * fVar164,
                            CONCAT48(fVar162 * fVar162,CONCAT44(fVar160 * fVar160,fVar143 * fVar143)
                                    )));
    auVar17 = vsubps_avx(ZEXT1632(auVar211),auVar42);
    fVar171 = auVar12._28_4_ + auVar231._28_4_;
    fVar143 = (auVar12._0_4_ + auVar231._0_4_) * 1.0000002;
    fVar160 = (auVar12._4_4_ + auVar231._4_4_) * 1.0000002;
    fVar162 = (auVar12._8_4_ + auVar231._8_4_) * 1.0000002;
    fVar164 = (auVar12._12_4_ + auVar231._12_4_) * 1.0000002;
    fVar166 = (auVar12._16_4_ + auVar231._16_4_) * 1.0000002;
    fVar168 = (auVar12._20_4_ + auVar231._20_4_) * 1.0000002;
    fVar170 = (auVar12._24_4_ + auVar231._24_4_) * 1.0000002;
    auVar43._4_4_ = fVar160 * fVar160;
    auVar43._0_4_ = fVar143 * fVar143;
    auVar43._8_4_ = fVar162 * fVar162;
    auVar43._12_4_ = fVar164 * fVar164;
    auVar43._16_4_ = fVar166 * fVar166;
    auVar43._20_4_ = fVar168 * fVar168;
    auVar43._24_4_ = fVar170 * fVar170;
    auVar43._28_4_ = fVar171;
    fVar143 = auVar101._0_4_ + auVar101._0_4_;
    fVar160 = auVar101._4_4_ + auVar101._4_4_;
    local_2e0._0_8_ = CONCAT44(fVar160,fVar143);
    local_2e0._8_4_ = auVar101._8_4_ + auVar101._8_4_;
    local_2e0._12_4_ = auVar101._12_4_ + auVar101._12_4_;
    local_2e0._16_4_ = auVar101._16_4_ + auVar101._16_4_;
    local_2e0._20_4_ = auVar101._20_4_ + auVar101._20_4_;
    local_2e0._24_4_ = auVar101._24_4_ + auVar101._24_4_;
    local_2e0._28_4_ = auVar101._28_4_ + auVar101._28_4_;
    auVar231 = vsubps_avx(auVar17,auVar43);
    local_320 = ZEXT1632(auVar6);
    auVar44._28_4_ = auVar17._28_4_;
    auVar44._0_28_ =
         ZEXT1628(CONCAT412(fVar270 * fVar270,
                            CONCAT48(fVar269 * fVar269,CONCAT44(fVar279 * fVar279,fVar278 * fVar278)
                                    )));
    auVar207 = vsubps_avx(local_260,auVar44);
    auVar45._4_4_ = fVar160 * fVar160;
    auVar45._0_4_ = fVar143 * fVar143;
    auVar45._8_4_ = local_2e0._8_4_ * local_2e0._8_4_;
    auVar45._12_4_ = local_2e0._12_4_ * local_2e0._12_4_;
    auVar45._16_4_ = local_2e0._16_4_ * local_2e0._16_4_;
    auVar45._20_4_ = local_2e0._20_4_ * local_2e0._20_4_;
    auVar45._24_4_ = local_2e0._24_4_ * local_2e0._24_4_;
    auVar45._28_4_ = auVar12._28_4_;
    fVar162 = auVar207._0_4_;
    fVar164 = auVar207._4_4_;
    fVar166 = auVar207._8_4_;
    fVar168 = auVar207._12_4_;
    fVar170 = auVar207._16_4_;
    fVar278 = auVar207._20_4_;
    fVar279 = auVar207._24_4_;
    auVar46._4_4_ = auVar231._4_4_ * fVar164 * 4.0;
    auVar46._0_4_ = auVar231._0_4_ * fVar162 * 4.0;
    auVar46._8_4_ = auVar231._8_4_ * fVar166 * 4.0;
    auVar46._12_4_ = auVar231._12_4_ * fVar168 * 4.0;
    auVar46._16_4_ = auVar231._16_4_ * fVar170 * 4.0;
    auVar46._20_4_ = auVar231._20_4_ * fVar278 * 4.0;
    auVar46._24_4_ = auVar231._24_4_ * fVar279 * 4.0;
    auVar46._28_4_ = fVar171;
    auVar189 = vsubps_avx(auVar45,auVar46);
    auVar101 = vcmpps_avx(auVar189,auVar205,5);
    auVar253 = ZEXT3264(auVar101);
    local_700 = vandps_avx(auVar44,local_6e0);
    local_300._0_4_ = fVar162 + fVar162;
    local_300._4_4_ = fVar164 + fVar164;
    local_300._8_4_ = fVar166 + fVar166;
    local_300._12_4_ = fVar168 + fVar168;
    local_300._16_4_ = fVar170 + fVar170;
    local_300._20_4_ = fVar278 + fVar278;
    local_300._24_4_ = fVar279 + fVar279;
    local_300._28_4_ = auVar207._28_4_ + auVar207._28_4_;
    local_660 = vandps_avx(auVar207,local_6e0);
    local_420 = ZEXT1632(auVar91);
    if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar101 >> 0x7f,0) == '\0') &&
          (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar101 >> 0xbf,0) == '\0') &&
        (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar101[0x1f])
    {
      auVar232._8_4_ = 0x7f800000;
      auVar232._0_8_ = 0x7f8000007f800000;
      auVar232._12_4_ = 0x7f800000;
      auVar232._16_4_ = 0x7f800000;
      auVar232._20_4_ = 0x7f800000;
      auVar232._24_4_ = 0x7f800000;
      auVar232._28_4_ = 0x7f800000;
      auVar267 = ZEXT3264(CONCAT428(0xff800000,
                                    CONCAT424(0xff800000,
                                              CONCAT420(0xff800000,
                                                        CONCAT416(0xff800000,
                                                                  CONCAT412(0xff800000,
                                                                            CONCAT48(0xff800000,
                                                                                                                                                                          
                                                  0xff800000ff800000)))))));
    }
    else {
      auVar238 = vsqrtps_avx(auVar189);
      auVar101 = vrcpps_avx(local_300);
      auVar207 = vcmpps_avx(auVar189,auVar205,5);
      auVar233._8_4_ = 0x3f800000;
      auVar233._0_8_ = 0x3f8000003f800000;
      auVar233._12_4_ = 0x3f800000;
      auVar233._16_4_ = 0x3f800000;
      auVar233._20_4_ = 0x3f800000;
      auVar233._24_4_ = 0x3f800000;
      auVar233._28_4_ = 0x3f800000;
      auVar6 = vfnmadd213ps_fma(auVar101,local_300,auVar233);
      auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar101,auVar101);
      auVar104._0_8_ = local_2e0._0_8_ ^ 0x8000000080000000;
      auVar104._8_4_ = -local_2e0._8_4_;
      auVar104._12_4_ = -local_2e0._12_4_;
      auVar104._16_4_ = -local_2e0._16_4_;
      auVar104._20_4_ = -local_2e0._20_4_;
      auVar104._24_4_ = -local_2e0._24_4_;
      auVar104._28_4_ = -local_2e0._28_4_;
      auVar101 = vsubps_avx(auVar104,auVar238);
      auVar47._4_4_ = auVar101._4_4_ * auVar6._4_4_;
      auVar47._0_4_ = auVar101._0_4_ * auVar6._0_4_;
      auVar47._8_4_ = auVar101._8_4_ * auVar6._8_4_;
      auVar47._12_4_ = auVar101._12_4_ * auVar6._12_4_;
      auVar47._16_4_ = auVar101._16_4_ * 0.0;
      auVar47._20_4_ = auVar101._20_4_ * 0.0;
      auVar47._24_4_ = auVar101._24_4_ * 0.0;
      auVar47._28_4_ = auVar101._28_4_;
      auVar101 = vsubps_avx(auVar238,local_2e0);
      auVar218._0_4_ = auVar101._0_4_ * auVar6._0_4_;
      auVar218._4_4_ = auVar101._4_4_ * auVar6._4_4_;
      auVar218._8_4_ = auVar101._8_4_ * auVar6._8_4_;
      auVar218._12_4_ = auVar101._12_4_ * auVar6._12_4_;
      auVar218._16_4_ = auVar101._16_4_ * 0.0;
      auVar218._20_4_ = auVar101._20_4_ * 0.0;
      auVar218._24_4_ = auVar101._24_4_ * 0.0;
      auVar218._28_4_ = 0;
      auVar6 = vfmadd213ps_fma(local_320,auVar47,local_420);
      local_400 = fVar142 * auVar6._0_4_;
      fStack_3fc = fVar169 * auVar6._4_4_;
      fStack_3f8 = fVar159 * auVar6._8_4_;
      fStack_3f4 = fVar161 * auVar6._12_4_;
      uStack_3f0 = 0;
      uStack_3ec = 0;
      uStack_3e8 = 0;
      fStack_3e4 = local_300._28_4_;
      auVar6 = vfmadd213ps_fma(local_320,auVar218,local_420);
      local_3e0 = fVar142 * auVar6._0_4_;
      fStack_3dc = fVar169 * auVar6._4_4_;
      fStack_3d8 = fVar159 * auVar6._8_4_;
      fStack_3d4 = fVar161 * auVar6._12_4_;
      uStack_3d0 = 0;
      uStack_3cc = 0;
      uStack_3c8 = 0;
      uStack_3c4 = 0x3f800000;
      auVar234._8_4_ = 0x7f800000;
      auVar234._0_8_ = 0x7f8000007f800000;
      auVar234._12_4_ = 0x7f800000;
      auVar234._16_4_ = 0x7f800000;
      auVar234._20_4_ = 0x7f800000;
      auVar234._24_4_ = 0x7f800000;
      auVar234._28_4_ = 0x7f800000;
      auVar232 = vblendvps_avx(auVar234,auVar47,auVar207);
      auVar105._8_4_ = 0xff800000;
      auVar105._0_8_ = 0xff800000ff800000;
      auVar105._12_4_ = 0xff800000;
      auVar105._16_4_ = 0xff800000;
      auVar105._20_4_ = 0xff800000;
      auVar105._24_4_ = 0xff800000;
      auVar105._28_4_ = 0xff800000;
      auVar101 = vblendvps_avx(auVar105,auVar218,auVar207);
      auVar267 = ZEXT3264(auVar101);
      auVar189 = vmaxps_avx(local_5a0,local_700);
      auVar48._4_4_ = auVar189._4_4_ * 1.9073486e-06;
      auVar48._0_4_ = auVar189._0_4_ * 1.9073486e-06;
      auVar48._8_4_ = auVar189._8_4_ * 1.9073486e-06;
      auVar48._12_4_ = auVar189._12_4_ * 1.9073486e-06;
      auVar48._16_4_ = auVar189._16_4_ * 1.9073486e-06;
      auVar48._20_4_ = auVar189._20_4_ * 1.9073486e-06;
      auVar48._24_4_ = auVar189._24_4_ * 1.9073486e-06;
      auVar48._28_4_ = auVar189._28_4_;
      auVar189 = vcmpps_avx(local_660,auVar48,1);
      auVar205 = auVar207 & auVar189;
      if ((((((((auVar205 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar205 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar205 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar205 >> 0x7f,0) == '\0') &&
            (auVar205 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar205 >> 0xbf,0) == '\0') &&
          (auVar205 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar205[0x1f]) {
        auVar248 = ZEXT3264(ZEXT1632(auVar97));
      }
      else {
        auVar189 = vandps_avx(auVar189,auVar207);
        auVar205 = vcmpps_avx(auVar231,_DAT_01f7b000,2);
        auVar252._8_4_ = 0xff800000;
        auVar252._0_8_ = 0xff800000ff800000;
        auVar252._12_4_ = 0xff800000;
        auVar252._16_4_ = 0xff800000;
        auVar252._20_4_ = 0xff800000;
        auVar252._24_4_ = 0xff800000;
        auVar252._28_4_ = 0xff800000;
        auVar237._8_4_ = 0x7f800000;
        auVar237._0_8_ = 0x7f8000007f800000;
        auVar237._12_4_ = 0x7f800000;
        auVar237._16_4_ = 0x7f800000;
        auVar237._20_4_ = 0x7f800000;
        auVar237._24_4_ = 0x7f800000;
        auVar237._28_4_ = 0x7f800000;
        auVar231 = vblendvps_avx(auVar237,auVar252,auVar205);
        auVar6 = vpackssdw_avx(auVar189._0_16_,auVar189._16_16_);
        auVar238 = vpmovsxwd_avx2(auVar6);
        auVar232 = vblendvps_avx(auVar232,auVar231,auVar238);
        auVar231 = vblendvps_avx(auVar252,auVar237,auVar205);
        auVar101 = vblendvps_avx(auVar101,auVar231,auVar238);
        auVar267 = ZEXT3264(auVar101);
        auVar115._0_8_ = auVar189._0_8_ ^ 0xffffffffffffffff;
        auVar115._8_4_ = auVar189._8_4_ ^ 0xffffffff;
        auVar115._12_4_ = auVar189._12_4_ ^ 0xffffffff;
        auVar115._16_4_ = auVar189._16_4_ ^ 0xffffffff;
        auVar115._20_4_ = auVar189._20_4_ ^ 0xffffffff;
        auVar115._24_4_ = auVar189._24_4_ ^ 0xffffffff;
        auVar115._28_4_ = auVar189._28_4_ ^ 0xffffffff;
        auVar101 = vorps_avx(auVar205,auVar115);
        auVar101 = vandps_avx(auVar207,auVar101);
        auVar253 = ZEXT3264(auVar101);
        auVar248 = ZEXT3264(ZEXT1632(auVar97));
      }
    }
    auVar231 = auVar253._0_32_;
    auVar101 = local_520 & auVar231;
    fVar142 = (float)local_900._0_4_;
    fVar169 = (float)local_900._4_4_;
    fVar159 = fStack_8f8;
    fVar171 = fStack_8f4;
    fVar161 = fStack_8f0;
    fVar269 = fStack_8ec;
    fVar270 = fStack_8e8;
    fVar255 = fStack_8e4;
    if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar101 >> 0x7f,0) == '\0') &&
          (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar101 >> 0xbf,0) == '\0') &&
        (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar101[0x1f])
    {
LAB_012c4bee:
      auVar267 = ZEXT3264(local_9c0);
    }
    else {
      auVar244 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x80));
      fVar256 = *(float *)(ray + k * 4 + 0x80) - (float)local_940._0_4_;
      auVar106._4_4_ = fVar256;
      auVar106._0_4_ = fVar256;
      auVar106._8_4_ = fVar256;
      auVar106._12_4_ = fVar256;
      auVar106._16_4_ = fVar256;
      auVar106._20_4_ = fVar256;
      auVar106._24_4_ = fVar256;
      auVar106._28_4_ = fVar256;
      auVar189 = vminps_avx(auVar106,auVar267._0_32_);
      auVar221._0_4_ = auVar262._0_4_ * fVar163;
      auVar221._4_4_ = auVar262._4_4_ * fVar165;
      auVar221._8_4_ = auVar262._8_4_ * fVar167;
      auVar221._12_4_ = auVar262._12_4_ * fVar195;
      auVar221._16_4_ = auVar262._16_4_ * fVar196;
      auVar221._20_4_ = auVar262._20_4_ * fVar173;
      auVar221._28_36_ = auVar267._28_36_;
      auVar221._24_4_ = auVar262._24_4_ * fVar194;
      auVar97 = vfmadd213ps_fma(auVar15,auVar246,auVar221._0_32_);
      auVar73._4_4_ = fStack_39c;
      auVar73._0_4_ = local_3a0;
      auVar73._8_4_ = fStack_398;
      auVar73._12_4_ = fStack_394;
      auVar73._16_4_ = fStack_390;
      auVar73._20_4_ = fStack_38c;
      auVar73._24_4_ = fStack_388;
      auVar73._28_4_ = fStack_384;
      auVar207 = vmaxps_avx(auVar73,auVar232);
      auVar6 = vfmadd213ps_fma(auVar16,local_7e0,ZEXT1632(auVar97));
      auVar253 = ZEXT3264(_local_6c0);
      auVar204._0_4_ = (float)local_6c0._0_4_ * auVar262._0_4_;
      auVar204._4_4_ = (float)local_6c0._4_4_ * auVar262._4_4_;
      auVar204._8_4_ = fStack_6b8 * auVar262._8_4_;
      auVar204._12_4_ = fStack_6b4 * auVar262._12_4_;
      auVar204._16_4_ = fStack_6b0 * auVar262._16_4_;
      auVar204._20_4_ = fStack_6ac * auVar262._20_4_;
      auVar204._24_4_ = fStack_6a8 * auVar262._24_4_;
      auVar204._28_4_ = 0;
      auVar97 = vfmadd231ps_fma(auVar204,_local_6a0,auVar246);
      auVar91 = vfmadd231ps_fma(ZEXT1632(auVar97),_local_680,local_7e0);
      auVar101 = vandps_avx(local_6e0,ZEXT1632(auVar91));
      auVar224._8_4_ = 0x219392ef;
      auVar224._0_8_ = 0x219392ef219392ef;
      auVar224._12_4_ = 0x219392ef;
      auVar224._16_4_ = 0x219392ef;
      auVar224._20_4_ = 0x219392ef;
      auVar224._24_4_ = 0x219392ef;
      auVar224._28_4_ = 0x219392ef;
      auVar15 = vcmpps_avx(auVar101,auVar224,1);
      auVar101 = vrcpps_avx(ZEXT1632(auVar91));
      auVar272._8_4_ = 0x3f800000;
      auVar272._0_8_ = 0x3f8000003f800000;
      auVar272._12_4_ = 0x3f800000;
      auVar272._16_4_ = 0x3f800000;
      auVar272._20_4_ = 0x3f800000;
      auVar272._24_4_ = 0x3f800000;
      auVar272._28_4_ = 0x3f800000;
      auVar205 = ZEXT1632(auVar91);
      auVar97 = vfnmadd213ps_fma(auVar101,auVar205,auVar272);
      auVar97 = vfmadd132ps_fma(ZEXT1632(auVar97),auVar101,auVar101);
      auVar273._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
      auVar273._8_4_ = auVar91._8_4_ ^ 0x80000000;
      auVar273._12_4_ = auVar91._12_4_ ^ 0x80000000;
      auVar273._16_4_ = 0x80000000;
      auVar273._20_4_ = 0x80000000;
      auVar273._24_4_ = 0x80000000;
      auVar273._28_4_ = 0x80000000;
      auVar49._4_4_ = auVar97._4_4_ * -auVar6._4_4_;
      auVar49._0_4_ = auVar97._0_4_ * -auVar6._0_4_;
      auVar49._8_4_ = auVar97._8_4_ * -auVar6._8_4_;
      auVar49._12_4_ = auVar97._12_4_ * -auVar6._12_4_;
      auVar49._16_4_ = 0x80000000;
      auVar49._20_4_ = 0x80000000;
      auVar49._24_4_ = 0x80000000;
      auVar49._28_4_ = 0x80000000;
      auVar101 = vcmpps_avx(auVar205,auVar273,1);
      auVar101 = vorps_avx(auVar15,auVar101);
      auVar235._8_4_ = 0xff800000;
      auVar235._0_8_ = 0xff800000ff800000;
      auVar235._12_4_ = 0xff800000;
      auVar235._16_4_ = 0xff800000;
      auVar235._20_4_ = 0xff800000;
      auVar235._24_4_ = 0xff800000;
      auVar235._28_4_ = 0xff800000;
      auVar101 = vblendvps_avx(auVar49,auVar235,auVar101);
      auVar16 = vmaxps_avx(auVar207,auVar101);
      auVar101 = vcmpps_avx(auVar205,auVar273,6);
      auVar101 = vorps_avx(auVar15,auVar101);
      auVar274._8_4_ = 0x7f800000;
      auVar274._0_8_ = 0x7f8000007f800000;
      auVar274._12_4_ = 0x7f800000;
      auVar274._16_4_ = 0x7f800000;
      auVar274._20_4_ = 0x7f800000;
      auVar274._24_4_ = 0x7f800000;
      auVar274._28_4_ = 0x7f800000;
      auVar101 = vblendvps_avx(auVar49,auVar274,auVar101);
      auVar207 = vminps_avx(auVar189,auVar101);
      fVar173 = -local_800._0_4_;
      fVar194 = -local_800._4_4_;
      fVar163 = -local_800._8_4_;
      fVar165 = -local_800._12_4_;
      fVar167 = -local_800._16_4_;
      fVar195 = -local_800._20_4_;
      fVar196 = -local_800._24_4_;
      auVar206._0_8_ = local_9e0._0_8_ ^ 0x8000000080000000;
      auVar206._8_4_ = -local_9e0._8_4_;
      auVar206._12_4_ = -local_9e0._12_4_;
      auVar206._16_4_ = -local_9e0._16_4_;
      auVar206._20_4_ = -local_9e0._20_4_;
      auVar206._24_4_ = -local_9e0._24_4_;
      auVar206._28_4_ = local_9e0._28_4_ ^ 0x80000000;
      auVar101 = vsubps_avx(ZEXT832(0) << 0x20,_local_960);
      auVar15 = vsubps_avx(ZEXT832(0) << 0x20,auVar133);
      auVar50._4_4_ = auVar15._4_4_ * fVar194;
      auVar50._0_4_ = auVar15._0_4_ * fVar173;
      auVar50._8_4_ = auVar15._8_4_ * fVar163;
      auVar50._12_4_ = auVar15._12_4_ * fVar165;
      auVar50._16_4_ = auVar15._16_4_ * fVar167;
      auVar50._20_4_ = auVar15._20_4_ * fVar195;
      auVar50._24_4_ = auVar15._24_4_ * fVar196;
      auVar50._28_4_ = auVar15._28_4_;
      auVar97 = vfmadd231ps_fma(auVar50,auVar206,auVar101);
      auVar219._0_8_ = local_9a0._0_8_ ^ 0x8000000080000000;
      auVar219._8_4_ = -local_9a0._8_4_;
      auVar219._12_4_ = -local_9a0._12_4_;
      auVar219._16_4_ = -local_9a0._16_4_;
      auVar219._20_4_ = -local_9a0._20_4_;
      auVar219._24_4_ = -local_9a0._24_4_;
      auVar219._28_4_ = local_9a0._28_4_ ^ 0x80000000;
      auVar101 = vsubps_avx(ZEXT832(0) << 0x20,auVar226);
      auVar6 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar219,auVar101);
      auVar51._4_4_ = (float)local_6c0._4_4_ * fVar194;
      auVar51._0_4_ = (float)local_6c0._0_4_ * fVar173;
      auVar51._8_4_ = fStack_6b8 * fVar163;
      auVar51._12_4_ = fStack_6b4 * fVar165;
      auVar51._16_4_ = fStack_6b0 * fVar167;
      auVar51._20_4_ = fStack_6ac * fVar195;
      auVar51._24_4_ = fStack_6a8 * fVar196;
      auVar51._28_4_ = local_800._28_4_ ^ 0x80000000;
      auVar97 = vfmadd231ps_fma(auVar51,_local_6a0,auVar206);
      auVar91 = vfmadd231ps_fma(ZEXT1632(auVar97),_local_680,auVar219);
      auVar101 = vandps_avx(local_6e0,ZEXT1632(auVar91));
      auVar189 = vrcpps_avx(ZEXT1632(auVar91));
      auVar107._8_4_ = 0x219392ef;
      auVar107._0_8_ = 0x219392ef219392ef;
      auVar107._12_4_ = 0x219392ef;
      auVar107._16_4_ = 0x219392ef;
      auVar107._20_4_ = 0x219392ef;
      auVar107._24_4_ = 0x219392ef;
      auVar107._28_4_ = 0x219392ef;
      auVar15 = vcmpps_avx(auVar101,auVar107,1);
      auVar108._8_4_ = 0x3f800000;
      auVar108._0_8_ = 0x3f8000003f800000;
      auVar108._12_4_ = 0x3f800000;
      auVar108._16_4_ = 0x3f800000;
      auVar108._20_4_ = 0x3f800000;
      auVar108._24_4_ = 0x3f800000;
      auVar108._28_4_ = 0x3f800000;
      auVar226 = ZEXT1632(auVar91);
      auVar97 = vfnmadd213ps_fma(auVar189,auVar226,auVar108);
      auVar97 = vfmadd132ps_fma(ZEXT1632(auVar97),auVar189,auVar189);
      auVar220._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
      auVar220._8_4_ = auVar91._8_4_ ^ 0x80000000;
      auVar220._12_4_ = auVar91._12_4_ ^ 0x80000000;
      auVar220._16_4_ = 0x80000000;
      auVar220._20_4_ = 0x80000000;
      auVar220._24_4_ = 0x80000000;
      auVar220._28_4_ = 0x80000000;
      auVar52._4_4_ = auVar97._4_4_ * -auVar6._4_4_;
      auVar52._0_4_ = auVar97._0_4_ * -auVar6._0_4_;
      auVar52._8_4_ = auVar97._8_4_ * -auVar6._8_4_;
      auVar52._12_4_ = auVar97._12_4_ * -auVar6._12_4_;
      auVar52._16_4_ = 0x80000000;
      auVar52._20_4_ = 0x80000000;
      auVar52._24_4_ = 0x80000000;
      auVar52._28_4_ = 0x80000000;
      auVar101 = vcmpps_avx(auVar226,auVar220,1);
      auVar101 = vorps_avx(auVar101,auVar15);
      auVar109._8_4_ = 0xff800000;
      auVar109._0_8_ = 0xff800000ff800000;
      auVar109._12_4_ = 0xff800000;
      auVar109._16_4_ = 0xff800000;
      auVar109._20_4_ = 0xff800000;
      auVar109._24_4_ = 0xff800000;
      auVar109._28_4_ = 0xff800000;
      auVar101 = vblendvps_avx(auVar52,auVar109,auVar101);
      auVar16 = vmaxps_avx(auVar16,auVar101);
      auVar101 = vcmpps_avx(auVar226,auVar220,6);
      auVar101 = vorps_avx(auVar15,auVar101);
      auVar15 = vblendvps_avx(auVar52,auVar274,auVar101);
      auVar101 = vandps_avx(auVar231,local_520);
      local_440 = vminps_avx(auVar207,auVar15);
      auVar231 = vcmpps_avx(auVar16,local_440,2);
      auVar15 = auVar101 & auVar231;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar15 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar15 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar15 >> 0x7f,0) == '\0') &&
            (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar15 >> 0xbf,0) == '\0') &&
          (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar15[0x1f])
      goto LAB_012c4bee;
      auVar71._4_4_ = fStack_3fc;
      auVar71._0_4_ = local_400;
      auVar71._8_4_ = fStack_3f8;
      auVar71._12_4_ = fStack_3f4;
      auVar71._16_4_ = uStack_3f0;
      auVar71._20_4_ = uStack_3ec;
      auVar71._24_4_ = uStack_3e8;
      auVar71._28_4_ = fStack_3e4;
      auVar225._8_4_ = 0x3f800000;
      auVar225._0_8_ = 0x3f8000003f800000;
      auVar225._12_4_ = 0x3f800000;
      auVar225._16_4_ = 0x3f800000;
      auVar225._20_4_ = 0x3f800000;
      auVar225._24_4_ = 0x3f800000;
      auVar225._28_4_ = 0x3f800000;
      auVar15 = vminps_avx(auVar71,auVar225);
      auVar189 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar15 = vmaxps_avx(auVar15,ZEXT832(0) << 0x20);
      auVar72._4_4_ = fStack_3dc;
      auVar72._0_4_ = local_3e0;
      auVar72._8_4_ = fStack_3d8;
      auVar72._12_4_ = fStack_3d4;
      auVar72._16_4_ = uStack_3d0;
      auVar72._20_4_ = uStack_3cc;
      auVar72._24_4_ = uStack_3c8;
      auVar72._28_4_ = uStack_3c4;
      auVar207 = vminps_avx(auVar72,auVar225);
      auVar207 = vmaxps_avx(auVar207,ZEXT832(0) << 0x20);
      auVar53._4_4_ = (auVar15._4_4_ + 1.0) * 0.125;
      auVar53._0_4_ = (auVar15._0_4_ + 0.0) * 0.125;
      auVar53._8_4_ = (auVar15._8_4_ + 2.0) * 0.125;
      auVar53._12_4_ = (auVar15._12_4_ + 3.0) * 0.125;
      auVar53._16_4_ = (auVar15._16_4_ + 4.0) * 0.125;
      auVar53._20_4_ = (auVar15._20_4_ + 5.0) * 0.125;
      auVar53._24_4_ = (auVar15._24_4_ + 6.0) * 0.125;
      auVar53._28_4_ = auVar15._28_4_ + 7.0;
      auVar97 = vfmadd213ps_fma(auVar53,local_a20,local_a00);
      auVar54._4_4_ = (auVar207._4_4_ + 1.0) * 0.125;
      auVar54._0_4_ = (auVar207._0_4_ + 0.0) * 0.125;
      auVar54._8_4_ = (auVar207._8_4_ + 2.0) * 0.125;
      auVar54._12_4_ = (auVar207._12_4_ + 3.0) * 0.125;
      auVar54._16_4_ = (auVar207._16_4_ + 4.0) * 0.125;
      auVar54._20_4_ = (auVar207._20_4_ + 5.0) * 0.125;
      auVar54._24_4_ = (auVar207._24_4_ + 6.0) * 0.125;
      auVar54._28_4_ = auVar207._28_4_ + 7.0;
      auVar6 = vfmadd213ps_fma(auVar54,local_a20,local_a00);
      auVar15 = vminps_avx(local_820,local_840);
      auVar207 = vminps_avx(local_860,local_880);
      auVar15 = vminps_avx(auVar15,auVar207);
      auVar12 = vsubps_avx(auVar15,auVar12);
      auVar101 = vandps_avx(auVar231,auVar101);
      local_1a0 = ZEXT1632(auVar97);
      local_1c0 = ZEXT1632(auVar6);
      auVar55._4_4_ = auVar12._4_4_ * 0.99999976;
      auVar55._0_4_ = auVar12._0_4_ * 0.99999976;
      auVar55._8_4_ = auVar12._8_4_ * 0.99999976;
      auVar55._12_4_ = auVar12._12_4_ * 0.99999976;
      auVar55._16_4_ = auVar12._16_4_ * 0.99999976;
      auVar55._20_4_ = auVar12._20_4_ * 0.99999976;
      auVar55._24_4_ = auVar12._24_4_ * 0.99999976;
      auVar55._28_4_ = 0x3f7ffffc;
      auVar231 = vmaxps_avx(ZEXT832(0) << 0x20,auVar55);
      auVar56._4_4_ = auVar231._4_4_ * auVar231._4_4_;
      auVar56._0_4_ = auVar231._0_4_ * auVar231._0_4_;
      auVar56._8_4_ = auVar231._8_4_ * auVar231._8_4_;
      auVar56._12_4_ = auVar231._12_4_ * auVar231._12_4_;
      auVar56._16_4_ = auVar231._16_4_ * auVar231._16_4_;
      auVar56._20_4_ = auVar231._20_4_ * auVar231._20_4_;
      auVar56._24_4_ = auVar231._24_4_ * auVar231._24_4_;
      auVar56._28_4_ = auVar231._28_4_;
      auVar12 = vsubps_avx(auVar17,auVar56);
      auVar57._4_4_ = auVar12._4_4_ * fVar164 * 4.0;
      auVar57._0_4_ = auVar12._0_4_ * fVar162 * 4.0;
      auVar57._8_4_ = auVar12._8_4_ * fVar166 * 4.0;
      auVar57._12_4_ = auVar12._12_4_ * fVar168 * 4.0;
      auVar57._16_4_ = auVar12._16_4_ * fVar170 * 4.0;
      auVar57._20_4_ = auVar12._20_4_ * fVar278 * 4.0;
      auVar57._24_4_ = auVar12._24_4_ * fVar279 * 4.0;
      auVar57._28_4_ = auVar231._28_4_;
      auVar15 = vsubps_avx(auVar45,auVar57);
      auVar231 = vcmpps_avx(auVar15,ZEXT832(0) << 0x20,5);
      if ((((((((auVar231 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar231 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar231 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar231 >> 0x7f,0) == '\0') &&
            (auVar231 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar231 >> 0xbf,0) == '\0') &&
          (auVar231 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar231[0x1f]) {
        auVar226 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar263 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar248 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar207 = ZEXT1232(ZEXT812(0)) << 0x20;
        _local_c00 = SUB3228(ZEXT832(0),0) << 0x20;
        auVar236._8_4_ = 0x7f800000;
        auVar236._0_8_ = 0x7f8000007f800000;
        auVar236._12_4_ = 0x7f800000;
        auVar236._16_4_ = 0x7f800000;
        auVar236._20_4_ = 0x7f800000;
        auVar236._24_4_ = 0x7f800000;
        auVar236._28_4_ = 0x7f800000;
        auVar251._8_4_ = 0xff800000;
        auVar251._0_8_ = 0xff800000ff800000;
        auVar251._12_4_ = 0xff800000;
        auVar251._16_4_ = 0xff800000;
        auVar251._20_4_ = 0xff800000;
        auVar251._24_4_ = 0xff800000;
        auVar251._28_4_ = 0xff800000;
      }
      else {
        auVar17 = vrcpps_avx(local_300);
        auVar208._8_4_ = 0x3f800000;
        auVar208._0_8_ = 0x3f8000003f800000;
        auVar208._12_4_ = 0x3f800000;
        auVar208._16_4_ = 0x3f800000;
        auVar208._20_4_ = 0x3f800000;
        auVar208._24_4_ = 0x3f800000;
        auVar208._28_4_ = 0x3f800000;
        auVar97 = vfnmadd213ps_fma(local_300,auVar17,auVar208);
        auVar207 = vsqrtps_avx(auVar15);
        auVar97 = vfmadd132ps_fma(ZEXT1632(auVar97),auVar17,auVar17);
        auVar190._0_8_ = CONCAT44(fVar160,fVar143) ^ 0x8000000080000000;
        auVar190._8_4_ = -local_2e0._8_4_;
        auVar190._12_4_ = -local_2e0._12_4_;
        auVar190._16_4_ = -local_2e0._16_4_;
        auVar190._20_4_ = -local_2e0._20_4_;
        auVar190._24_4_ = -local_2e0._24_4_;
        auVar190._28_4_ = -local_2e0._28_4_;
        auVar17 = vsubps_avx(auVar190,auVar207);
        auVar207 = vsubps_avx(auVar207,local_2e0);
        fVar143 = auVar17._0_4_ * auVar97._0_4_;
        fVar160 = auVar17._4_4_ * auVar97._4_4_;
        auVar58._4_4_ = fVar160;
        auVar58._0_4_ = fVar143;
        fVar162 = auVar17._8_4_ * auVar97._8_4_;
        auVar58._8_4_ = fVar162;
        fVar164 = auVar17._12_4_ * auVar97._12_4_;
        auVar58._12_4_ = fVar164;
        fVar166 = auVar17._16_4_ * 0.0;
        auVar58._16_4_ = fVar166;
        fVar168 = auVar17._20_4_ * 0.0;
        auVar58._20_4_ = fVar168;
        fVar170 = auVar17._24_4_ * 0.0;
        auVar58._24_4_ = fVar170;
        auVar58._28_4_ = local_2e0._28_4_;
        fVar173 = auVar207._0_4_ * auVar97._0_4_;
        fVar278 = auVar207._4_4_ * auVar97._4_4_;
        auVar59._4_4_ = fVar278;
        auVar59._0_4_ = fVar173;
        fVar194 = auVar207._8_4_ * auVar97._8_4_;
        auVar59._8_4_ = fVar194;
        fVar279 = auVar207._12_4_ * auVar97._12_4_;
        auVar59._12_4_ = fVar279;
        fVar163 = auVar207._16_4_ * 0.0;
        auVar59._16_4_ = fVar163;
        fVar165 = auVar207._20_4_ * 0.0;
        auVar59._20_4_ = fVar165;
        fVar167 = auVar207._24_4_ * 0.0;
        auVar59._24_4_ = fVar167;
        auVar59._28_4_ = 0x80000000;
        auVar97 = vfmadd213ps_fma(local_320,auVar58,local_420);
        auVar6 = vfmadd213ps_fma(local_320,auVar59,local_420);
        auVar191._0_4_ = auVar248._0_4_ * auVar97._0_4_;
        auVar191._4_4_ = auVar248._4_4_ * auVar97._4_4_;
        auVar191._8_4_ = auVar248._8_4_ * auVar97._8_4_;
        auVar191._12_4_ = auVar248._12_4_ * auVar97._12_4_;
        auVar191._16_4_ = auVar248._16_4_ * 0.0;
        auVar191._20_4_ = auVar248._20_4_ * 0.0;
        auVar191._24_4_ = auVar248._24_4_ * 0.0;
        auVar191._28_4_ = 0;
        auVar209._0_4_ = auVar248._0_4_ * auVar6._0_4_;
        auVar209._4_4_ = auVar248._4_4_ * auVar6._4_4_;
        auVar209._8_4_ = auVar248._8_4_ * auVar6._8_4_;
        auVar209._12_4_ = auVar248._12_4_ * auVar6._12_4_;
        auVar209._16_4_ = auVar248._16_4_ * 0.0;
        auVar209._20_4_ = auVar248._20_4_ * 0.0;
        auVar209._24_4_ = auVar248._24_4_ * 0.0;
        auVar209._28_4_ = 0;
        auVar97 = vfmadd213ps_fma(auVar13,auVar191,auVar185);
        auVar6 = vfmadd213ps_fma(auVar13,auVar209,auVar185);
        auVar91 = vfmadd213ps_fma(local_2c0,auVar191,auVar102);
        auVar211 = vfmadd213ps_fma(local_2c0,auVar209,auVar102);
        auVar212 = vfmadd213ps_fma(auVar191,auVar14,auVar230);
        auVar94 = vfmadd213ps_fma(auVar14,auVar209,auVar230);
        auVar60._4_4_ = (float)local_680._4_4_ * fVar160;
        auVar60._0_4_ = (float)local_680._0_4_ * fVar143;
        auVar60._8_4_ = fStack_678 * fVar162;
        auVar60._12_4_ = fStack_674 * fVar164;
        auVar60._16_4_ = fStack_670 * fVar166;
        auVar60._20_4_ = fStack_66c * fVar168;
        auVar60._24_4_ = fStack_668 * fVar170;
        auVar60._28_4_ = 0;
        auVar17 = vsubps_avx(auVar60,ZEXT1632(auVar97));
        auVar227._0_4_ = (float)local_6a0._0_4_ * fVar143;
        auVar227._4_4_ = (float)local_6a0._4_4_ * fVar160;
        auVar227._8_4_ = fStack_698 * fVar162;
        auVar227._12_4_ = fStack_694 * fVar164;
        auVar227._16_4_ = fStack_690 * fVar166;
        auVar227._20_4_ = fStack_68c * fVar168;
        auVar227._24_4_ = fStack_688 * fVar170;
        auVar227._28_4_ = 0;
        auVar207 = vsubps_avx(auVar227,ZEXT1632(auVar91));
        auVar61._4_4_ = (float)local_6c0._4_4_ * fVar160;
        auVar61._0_4_ = (float)local_6c0._0_4_ * fVar143;
        auVar61._8_4_ = fStack_6b8 * fVar162;
        auVar61._12_4_ = fStack_6b4 * fVar164;
        auVar61._16_4_ = fStack_6b0 * fVar166;
        auVar61._20_4_ = fStack_6ac * fVar168;
        auVar61._24_4_ = fStack_6a8 * fVar170;
        auVar61._28_4_ = 0;
        auVar13 = vsubps_avx(auVar61,ZEXT1632(auVar212));
        _local_c00 = auVar13._0_28_;
        auVar62._4_4_ = fVar278 * (float)local_680._4_4_;
        auVar62._0_4_ = fVar173 * (float)local_680._0_4_;
        auVar62._8_4_ = fVar194 * fStack_678;
        auVar62._12_4_ = fVar279 * fStack_674;
        auVar62._16_4_ = fVar163 * fStack_670;
        auVar62._20_4_ = fVar165 * fStack_66c;
        auVar62._24_4_ = fVar167 * fStack_668;
        auVar62._28_4_ = auVar13._28_4_;
        auVar189 = vsubps_avx(auVar62,ZEXT1632(auVar6));
        auVar63._4_4_ = (float)local_6a0._4_4_ * fVar278;
        auVar63._0_4_ = (float)local_6a0._0_4_ * fVar173;
        auVar63._8_4_ = fStack_698 * fVar194;
        auVar63._12_4_ = fStack_694 * fVar279;
        auVar63._16_4_ = fStack_690 * fVar163;
        auVar63._20_4_ = fStack_68c * fVar165;
        auVar63._24_4_ = fStack_688 * fVar167;
        auVar63._28_4_ = 0;
        auVar226 = vsubps_avx(auVar63,ZEXT1632(auVar211));
        auVar64._4_4_ = (float)local_6c0._4_4_ * fVar278;
        auVar64._0_4_ = (float)local_6c0._0_4_ * fVar173;
        auVar64._8_4_ = fStack_6b8 * fVar194;
        auVar64._12_4_ = fStack_6b4 * fVar279;
        auVar64._16_4_ = fStack_6b0 * fVar163;
        auVar64._20_4_ = fStack_6ac * fVar165;
        auVar64._24_4_ = fStack_6a8 * fVar167;
        auVar64._28_4_ = uStack_664;
        auVar13 = vsubps_avx(auVar64,ZEXT1632(auVar94));
        auVar263 = auVar13._0_28_;
        auVar13 = vcmpps_avx(auVar15,_DAT_01f7b000,5);
        auVar155._8_4_ = 0x7f800000;
        auVar155._0_8_ = 0x7f8000007f800000;
        auVar155._12_4_ = 0x7f800000;
        auVar155._16_4_ = 0x7f800000;
        auVar155._20_4_ = 0x7f800000;
        auVar155._24_4_ = 0x7f800000;
        auVar155._28_4_ = 0x7f800000;
        auVar236 = vblendvps_avx(auVar155,auVar58,auVar13);
        auVar14 = vmaxps_avx(local_5a0,local_700);
        auVar65._4_4_ = auVar14._4_4_ * 1.9073486e-06;
        auVar65._0_4_ = auVar14._0_4_ * 1.9073486e-06;
        auVar65._8_4_ = auVar14._8_4_ * 1.9073486e-06;
        auVar65._12_4_ = auVar14._12_4_ * 1.9073486e-06;
        auVar65._16_4_ = auVar14._16_4_ * 1.9073486e-06;
        auVar65._20_4_ = auVar14._20_4_ * 1.9073486e-06;
        auVar65._24_4_ = auVar14._24_4_ * 1.9073486e-06;
        auVar65._28_4_ = auVar14._28_4_;
        auVar14 = vcmpps_avx(local_660,auVar65,1);
        auVar156._8_4_ = 0xff800000;
        auVar156._0_8_ = 0xff800000ff800000;
        auVar156._12_4_ = 0xff800000;
        auVar156._16_4_ = 0xff800000;
        auVar156._20_4_ = 0xff800000;
        auVar156._24_4_ = 0xff800000;
        auVar156._28_4_ = 0xff800000;
        auVar251 = vblendvps_avx(auVar156,auVar59,auVar13);
        auVar15 = auVar13 & auVar14;
        if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar15 >> 0x7f,0) != '\0') ||
              (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0xbf,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar15[0x1f] < '\0') {
          auVar231 = vandps_avx(auVar13,auVar14);
          auVar14 = vcmpps_avx(auVar12,_DAT_01f7b000,2);
          auVar240._8_4_ = 0xff800000;
          auVar240._0_8_ = 0xff800000ff800000;
          auVar240._12_4_ = 0xff800000;
          auVar240._16_4_ = 0xff800000;
          auVar240._20_4_ = 0xff800000;
          auVar240._24_4_ = 0xff800000;
          auVar240._28_4_ = 0xff800000;
          auVar247._8_4_ = 0x7f800000;
          auVar247._0_8_ = 0x7f8000007f800000;
          auVar247._12_4_ = 0x7f800000;
          auVar247._16_4_ = 0x7f800000;
          auVar247._20_4_ = 0x7f800000;
          auVar247._24_4_ = 0x7f800000;
          auVar247._28_4_ = 0x7f800000;
          auVar12 = vblendvps_avx(auVar247,auVar240,auVar14);
          auVar97 = vpackssdw_avx(auVar231._0_16_,auVar231._16_16_);
          auVar15 = vpmovsxwd_avx2(auVar97);
          auVar236 = vblendvps_avx(auVar236,auVar12,auVar15);
          auVar12 = vblendvps_avx(auVar240,auVar247,auVar14);
          auVar251 = vblendvps_avx(auVar251,auVar12,auVar15);
          auVar158._0_8_ = auVar231._0_8_ ^ 0xffffffffffffffff;
          auVar158._8_4_ = auVar231._8_4_ ^ 0xffffffff;
          auVar158._12_4_ = auVar231._12_4_ ^ 0xffffffff;
          auVar158._16_4_ = auVar231._16_4_ ^ 0xffffffff;
          auVar158._20_4_ = auVar231._20_4_ ^ 0xffffffff;
          auVar158._24_4_ = auVar231._24_4_ ^ 0xffffffff;
          auVar158._28_4_ = auVar231._28_4_ ^ 0xffffffff;
          auVar231 = vorps_avx(auVar14,auVar158);
          auVar231 = vandps_avx(auVar13,auVar231);
        }
        auVar248 = ZEXT3264(auVar17);
      }
      auVar253 = ZEXT3264(auVar251);
      local_4a0 = auVar16;
      local_480 = vminps_avx(local_440,auVar236);
      _local_8c0 = vmaxps_avx(auVar16,auVar251);
      _local_460 = _local_8c0;
      auVar12 = vcmpps_avx(auVar16,local_480,2);
      local_5e0 = vandps_avx(auVar12,auVar101);
      auVar12 = vcmpps_avx(_local_8c0,local_440,2);
      _local_a40 = vandps_avx(auVar12,auVar101);
      auVar101 = vorps_avx(_local_a40,local_5e0);
      if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar101 >> 0x7f,0) == '\0') &&
            (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar101 >> 0xbf,0) == '\0') &&
          (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar101[0x1f]) {
        auVar267 = ZEXT3264(local_9c0);
      }
      else {
        auVar253 = ZEXT3264(local_5e0);
        auVar66._4_4_ = auVar263._4_4_ * (float)local_6c0._4_4_;
        auVar66._0_4_ = auVar263._0_4_ * (float)local_6c0._0_4_;
        auVar66._8_4_ = auVar263._8_4_ * fStack_6b8;
        auVar66._12_4_ = auVar263._12_4_ * fStack_6b4;
        auVar66._16_4_ = auVar263._16_4_ * fStack_6b0;
        auVar66._20_4_ = auVar263._20_4_ * fStack_6ac;
        auVar66._24_4_ = auVar263._24_4_ * fStack_6a8;
        auVar66._28_4_ = auVar101._28_4_;
        auVar97 = vfmadd213ps_fma(auVar226,_local_6a0,auVar66);
        auVar97 = vfmadd213ps_fma(auVar189,_local_680,ZEXT1632(auVar97));
        auVar112._0_8_ = auVar231._0_8_ ^ 0xffffffffffffffff;
        auVar112._8_4_ = auVar231._8_4_ ^ 0xffffffff;
        auVar112._12_4_ = auVar231._12_4_ ^ 0xffffffff;
        auVar112._16_4_ = auVar231._16_4_ ^ 0xffffffff;
        auVar112._20_4_ = auVar231._20_4_ ^ 0xffffffff;
        auVar112._24_4_ = auVar231._24_4_ ^ 0xffffffff;
        auVar112._28_4_ = auVar231._28_4_ ^ 0xffffffff;
        auVar101 = vandps_avx(ZEXT1632(auVar97),local_6e0);
        auVar192._8_4_ = 0x3e99999a;
        auVar192._0_8_ = 0x3e99999a3e99999a;
        auVar192._12_4_ = 0x3e99999a;
        auVar192._16_4_ = 0x3e99999a;
        auVar192._20_4_ = 0x3e99999a;
        auVar192._24_4_ = 0x3e99999a;
        auVar192._28_4_ = 0x3e99999a;
        auVar101 = vcmpps_avx(auVar101,auVar192,1);
        local_620 = vorps_avx(auVar101,auVar112);
        auVar67._4_4_ = (float)local_6c0._4_4_ * (float)local_c00._4_4_;
        auVar67._0_4_ = (float)local_6c0._0_4_ * (float)local_c00._0_4_;
        auVar67._8_4_ = fStack_6b8 * fStack_bf8;
        auVar67._12_4_ = fStack_6b4 * fStack_bf4;
        auVar67._16_4_ = fStack_6b0 * fStack_bf0;
        auVar67._20_4_ = fStack_6ac * fStack_bec;
        auVar67._24_4_ = fStack_6a8 * fStack_be8;
        auVar67._28_4_ = local_620._28_4_;
        auVar97 = vfmadd213ps_fma(auVar207,_local_6a0,auVar67);
        auVar97 = vfmadd213ps_fma(auVar248._0_32_,_local_680,ZEXT1632(auVar97));
        auVar248 = ZEXT1664(auVar97);
        auVar101 = vandps_avx(ZEXT1632(auVar97),local_6e0);
        auVar101 = vcmpps_avx(auVar101,auVar192,1);
        auVar101 = vorps_avx(auVar101,auVar112);
        auVar135._8_4_ = 3;
        auVar135._0_8_ = 0x300000003;
        auVar135._12_4_ = 3;
        auVar135._16_4_ = 3;
        auVar135._20_4_ = 3;
        auVar135._24_4_ = 3;
        auVar135._28_4_ = 3;
        auVar157._8_4_ = 2;
        auVar157._0_8_ = 0x200000002;
        auVar157._12_4_ = 2;
        auVar157._16_4_ = 2;
        auVar157._20_4_ = 2;
        auVar157._24_4_ = 2;
        auVar157._28_4_ = 2;
        auVar101 = vblendvps_avx(auVar157,auVar135,auVar101);
        local_640._4_4_ = local_c0c;
        local_640._0_4_ = local_c0c;
        local_640._8_4_ = local_c0c;
        local_640._12_4_ = local_c0c;
        local_640._16_4_ = local_c0c;
        local_640._20_4_ = local_c0c;
        local_640._24_4_ = local_c0c;
        local_640._28_4_ = local_c0c;
        local_600 = vpcmpgtd_avx2(auVar101,local_640);
        local_4c0 = vpandn_avx2(local_600,local_5e0);
        local_8a0._4_4_ = auVar16._4_4_ + (float)local_900._4_4_;
        local_8a0._0_4_ = auVar16._0_4_ + (float)local_900._0_4_;
        fStack_898 = auVar16._8_4_ + fStack_8f8;
        fStack_894 = auVar16._12_4_ + fStack_8f4;
        fStack_890 = auVar16._16_4_ + fStack_8f0;
        fStack_88c = auVar16._20_4_ + fStack_8ec;
        fStack_888 = auVar16._24_4_ + fStack_8e8;
        fStack_884 = auVar16._28_4_ + fStack_8e4;
        auVar267 = ZEXT3264(_local_a40);
        while( true ) {
          auVar101 = _local_460;
          fStack_b1c = auVar2._4_4_;
          fStack_b18 = auVar2._8_4_;
          fStack_b14 = auVar2._12_4_;
          if ((((((((local_4c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (local_4c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_4c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(local_4c0 >> 0x7f,0) == '\0') &&
                (local_4c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(local_4c0 >> 0xbf,0) == '\0') &&
              (local_4c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < local_4c0[0x1f]) break;
          auVar136._8_4_ = 0x7f800000;
          auVar136._0_8_ = 0x7f8000007f800000;
          auVar136._12_4_ = 0x7f800000;
          auVar136._16_4_ = 0x7f800000;
          auVar136._20_4_ = 0x7f800000;
          auVar136._24_4_ = 0x7f800000;
          auVar136._28_4_ = 0x7f800000;
          auVar101 = vblendvps_avx(auVar136,auVar16,local_4c0);
          auVar231 = vshufps_avx(auVar101,auVar101,0xb1);
          auVar231 = vminps_avx(auVar101,auVar231);
          auVar12 = vshufpd_avx(auVar231,auVar231,5);
          auVar231 = vminps_avx(auVar231,auVar12);
          auVar12 = vpermpd_avx2(auVar231,0x4e);
          auVar231 = vminps_avx(auVar231,auVar12);
          auVar231 = vcmpps_avx(auVar101,auVar231,0);
          auVar12 = local_4c0 & auVar231;
          auVar101 = local_4c0;
          if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar12 >> 0x7f,0) != '\0') ||
                (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar12 >> 0xbf,0) != '\0') ||
              (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar12[0x1f] < '\0') {
            auVar101 = vandps_avx(auVar231,local_4c0);
          }
          uVar78 = vmovmskps_avx(auVar101);
          iVar18 = 0;
          for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
            iVar18 = iVar18 + 1;
          }
          uVar81 = (ulong)(uint)(iVar18 << 2);
          *(undefined4 *)(local_4c0 + uVar81) = 0;
          uVar78 = *(uint *)(local_1a0 + uVar81);
          uVar82 = *(uint *)(local_4a0 + uVar81);
          fVar143 = auVar10._0_4_;
          if ((float)local_980._0_4_ < 0.0) {
            auVar248 = ZEXT1664(auVar248._0_16_);
            auVar253 = ZEXT1664(auVar253._0_16_);
            fVar143 = sqrtf((float)local_980._0_4_);
            uVar81 = extraout_RAX;
          }
          auVar6 = vminps_avx(auVar3,auVar5);
          auVar97 = vmaxps_avx(auVar3,auVar5);
          auVar91 = vminps_avx(auVar4,auVar2);
          auVar211 = vminps_avx(auVar6,auVar91);
          auVar6 = vmaxps_avx(auVar4,auVar2);
          auVar91 = vmaxps_avx(auVar97,auVar6);
          local_9a0._8_4_ = 0x7fffffff;
          local_9a0._0_8_ = 0x7fffffff7fffffff;
          local_9a0._12_4_ = 0x7fffffff;
          auVar97 = vandps_avx(auVar211,local_9a0._0_16_);
          auVar6 = vandps_avx(auVar91,local_9a0._0_16_);
          auVar97 = vmaxps_avx(auVar97,auVar6);
          auVar6 = vmovshdup_avx(auVar97);
          auVar6 = vmaxss_avx(auVar6,auVar97);
          auVar97 = vshufpd_avx(auVar97,auVar97,1);
          auVar97 = vmaxss_avx(auVar97,auVar6);
          fVar160 = auVar97._0_4_ * 1.9073486e-06;
          local_800._0_4_ = fVar143 * 1.9073486e-06;
          local_880._0_16_ = vshufps_avx(auVar91,auVar91,0xff);
          auVar97 = vinsertps_avx(ZEXT416(uVar82),ZEXT416(uVar78),0x10);
          for (uVar84 = 0; bVar87 = (byte)uVar81, uVar84 != 5; uVar84 = uVar84 + 1) {
            auVar91 = vmovshdup_avx(auVar97);
            fVar169 = 1.0 - auVar91._0_4_;
            auVar6 = vshufps_avx(auVar97,auVar97,0x55);
            fVar143 = auVar6._0_4_;
            auVar119._0_4_ = fVar118 * fVar143;
            fVar142 = auVar6._4_4_;
            auVar119._4_4_ = auVar5._4_4_ * fVar142;
            fVar162 = auVar6._8_4_;
            auVar119._8_4_ = auVar5._8_4_ * fVar162;
            fVar164 = auVar6._12_4_;
            auVar119._12_4_ = auVar5._12_4_ * fVar164;
            auVar144._4_4_ = fVar169;
            auVar144._0_4_ = fVar169;
            auVar144._8_4_ = fVar169;
            auVar144._12_4_ = fVar169;
            auVar6 = vfmadd231ps_fma(auVar119,auVar144,auVar3);
            auVar174._0_4_ = fVar141 * fVar143;
            auVar174._4_4_ = auVar4._4_4_ * fVar142;
            auVar174._8_4_ = auVar4._8_4_ * fVar162;
            auVar174._12_4_ = auVar4._12_4_ * fVar164;
            auVar211 = vfmadd231ps_fma(auVar174,auVar144,auVar5);
            auVar213._0_4_ = fVar143 * auVar211._0_4_;
            auVar213._4_4_ = fVar142 * auVar211._4_4_;
            auVar213._8_4_ = fVar162 * auVar211._8_4_;
            auVar213._12_4_ = fVar164 * auVar211._12_4_;
            auVar212 = vfmadd231ps_fma(auVar213,auVar144,auVar6);
            auVar120._0_4_ = fVar143 * fVar172;
            auVar120._4_4_ = fVar142 * fStack_b1c;
            auVar120._8_4_ = fVar162 * fStack_b18;
            auVar120._12_4_ = fVar164 * fStack_b14;
            auVar6 = vfmadd231ps_fma(auVar120,auVar144,auVar4);
            auVar197._0_4_ = fVar143 * auVar6._0_4_;
            auVar197._4_4_ = fVar142 * auVar6._4_4_;
            auVar197._8_4_ = fVar162 * auVar6._8_4_;
            auVar197._12_4_ = fVar164 * auVar6._12_4_;
            auVar211 = vfmadd231ps_fma(auVar197,auVar144,auVar211);
            fVar166 = auVar97._0_4_;
            auVar121._4_4_ = fVar166;
            auVar121._0_4_ = fVar166;
            auVar121._8_4_ = fVar166;
            auVar121._12_4_ = fVar166;
            auVar6 = vfmadd213ps_fma(auVar121,local_970,_DAT_01f45a50);
            auVar93._0_4_ = fVar143 * auVar211._0_4_;
            auVar93._4_4_ = fVar142 * auVar211._4_4_;
            auVar93._8_4_ = fVar162 * auVar211._8_4_;
            auVar93._12_4_ = fVar164 * auVar211._12_4_;
            auVar94 = vfmadd231ps_fma(auVar93,auVar212,auVar144);
            local_7e0._0_16_ = auVar94;
            auVar6 = vsubps_avx(auVar6,auVar94);
            _local_960 = auVar6;
            auVar6 = vdpps_avx(auVar6,auVar6,0x7f);
            fVar143 = auVar6._0_4_;
            if (fVar143 < 0.0) {
              local_9e0._0_16_ = auVar212;
              auVar117._0_4_ = sqrtf(fVar143);
              auVar117._4_60_ = extraout_var;
              auVar94 = auVar117._0_16_;
              uVar81 = extraout_RAX_00;
              auVar212 = local_9e0._0_16_;
            }
            else {
              auVar94 = vsqrtss_avx(auVar6,auVar6);
            }
            auVar211 = vsubps_avx(auVar211,auVar212);
            auVar228._0_4_ = auVar211._0_4_ * 3.0;
            auVar228._4_4_ = auVar211._4_4_ * 3.0;
            auVar228._8_4_ = auVar211._8_4_ * 3.0;
            auVar228._12_4_ = auVar211._12_4_ * 3.0;
            auVar211 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar169),auVar91
                                      );
            auVar212 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar91,ZEXT416((uint)fVar169)
                                      );
            fVar169 = fVar169 * 6.0;
            fVar142 = auVar211._0_4_ * 6.0;
            fVar162 = auVar212._0_4_ * 6.0;
            fVar164 = auVar91._0_4_ * 6.0;
            auVar175._0_4_ = fVar164 * fVar172;
            auVar175._4_4_ = fVar164 * fStack_b1c;
            auVar175._8_4_ = fVar164 * fStack_b18;
            auVar175._12_4_ = fVar164 * fStack_b14;
            auVar122._4_4_ = fVar162;
            auVar122._0_4_ = fVar162;
            auVar122._8_4_ = fVar162;
            auVar122._12_4_ = fVar162;
            auVar91 = vfmadd132ps_fma(auVar122,auVar175,auVar4);
            auVar176._4_4_ = fVar142;
            auVar176._0_4_ = fVar142;
            auVar176._8_4_ = fVar142;
            auVar176._12_4_ = fVar142;
            auVar91 = vfmadd132ps_fma(auVar176,auVar91,auVar5);
            auVar211 = vdpps_avx(auVar228,auVar228,0x7f);
            auVar123._4_4_ = fVar169;
            auVar123._0_4_ = fVar169;
            auVar123._8_4_ = fVar169;
            auVar123._12_4_ = fVar169;
            auVar249 = vfmadd132ps_fma(auVar123,auVar91,auVar3);
            auVar91 = vblendps_avx(auVar211,_DAT_01f45a50,0xe);
            auVar212 = vrsqrtss_avx(auVar91,auVar91);
            fVar164 = auVar211._0_4_;
            fVar142 = auVar212._0_4_;
            auVar212 = vdpps_avx(auVar228,auVar249,0x7f);
            fVar142 = fVar142 * 1.5 + fVar164 * -0.5 * fVar142 * fVar142 * fVar142;
            auVar124._0_4_ = auVar249._0_4_ * fVar164;
            auVar124._4_4_ = auVar249._4_4_ * fVar164;
            auVar124._8_4_ = auVar249._8_4_ * fVar164;
            auVar124._12_4_ = auVar249._12_4_ * fVar164;
            fVar162 = auVar212._0_4_;
            auVar214._0_4_ = auVar228._0_4_ * fVar162;
            auVar214._4_4_ = auVar228._4_4_ * fVar162;
            auVar214._8_4_ = auVar228._8_4_ * fVar162;
            auVar214._12_4_ = auVar228._12_4_ * fVar162;
            auVar212 = vsubps_avx(auVar124,auVar214);
            auVar91 = vrcpss_avx(auVar91,auVar91);
            auVar249 = vfnmadd213ss_fma(auVar91,auVar211,ZEXT416(0x40000000));
            fVar162 = auVar91._0_4_ * auVar249._0_4_;
            auVar91 = vmaxss_avx(ZEXT416((uint)fVar160),
                                 ZEXT416((uint)(fVar166 * (float)local_800._0_4_)));
            auVar248 = ZEXT1664(auVar91);
            uVar68 = CONCAT44(auVar228._4_4_,auVar228._0_4_);
            auVar222._0_8_ = uVar68 ^ 0x8000000080000000;
            auVar222._8_4_ = -auVar228._8_4_;
            auVar222._12_4_ = -auVar228._12_4_;
            auVar177._0_4_ = fVar142 * auVar212._0_4_ * fVar162;
            auVar177._4_4_ = fVar142 * auVar212._4_4_ * fVar162;
            auVar177._8_4_ = fVar142 * auVar212._8_4_ * fVar162;
            auVar177._12_4_ = fVar142 * auVar212._12_4_ * fVar162;
            auVar261._0_4_ = auVar228._0_4_ * fVar142;
            auVar261._4_4_ = auVar228._4_4_ * fVar142;
            auVar261._8_4_ = auVar228._8_4_ * fVar142;
            auVar261._12_4_ = auVar228._12_4_ * fVar142;
            if (fVar164 < -fVar164) {
              local_9e0._0_4_ = auVar94._0_4_;
              local_a00._0_16_ = auVar261;
              local_a20._0_16_ = auVar177;
              fVar142 = sqrtf(fVar164);
              auVar94 = ZEXT416((uint)local_9e0._0_4_);
              auVar248 = ZEXT464(auVar91._0_4_);
              uVar81 = extraout_RAX_01;
              auVar177 = local_a20._0_16_;
              auVar261 = local_a00._0_16_;
            }
            else {
              auVar211 = vsqrtss_avx(auVar211,auVar211);
              fVar142 = auVar211._0_4_;
            }
            auVar211 = vdpps_avx(_local_960,auVar261,0x7f);
            auVar275 = vfmadd213ss_fma(ZEXT416((uint)fVar160),auVar94,auVar248._0_16_);
            auVar212 = vdpps_avx(auVar222,auVar261,0x7f);
            auVar249 = vdpps_avx(_local_960,auVar177,0x7f);
            auVar260 = vdpps_avx(local_970,auVar261,0x7f);
            auVar275 = vfmadd213ss_fma(ZEXT416((uint)(auVar94._0_4_ + 1.0)),
                                       ZEXT416((uint)(fVar160 / fVar142)),auVar275);
            fVar142 = auVar212._0_4_ + auVar249._0_4_;
            auVar95._0_4_ = auVar211._0_4_ * auVar211._0_4_;
            auVar95._4_4_ = auVar211._4_4_ * auVar211._4_4_;
            auVar95._8_4_ = auVar211._8_4_ * auVar211._8_4_;
            auVar95._12_4_ = auVar211._12_4_ * auVar211._12_4_;
            auVar212 = vdpps_avx(_local_960,auVar222,0x7f);
            auVar249 = vsubps_avx(auVar6,auVar95);
            auVar94 = vrsqrtss_avx(auVar249,auVar249);
            fVar164 = auVar249._0_4_;
            fVar162 = auVar94._0_4_;
            fVar162 = fVar162 * 1.5 + fVar164 * -0.5 * fVar162 * fVar162 * fVar162;
            auVar94 = vdpps_avx(_local_960,local_970,0x7f);
            auVar212 = vfnmadd231ss_fma(auVar212,auVar211,ZEXT416((uint)fVar142));
            auVar94 = vfnmadd231ss_fma(auVar94,auVar211,auVar260);
            if (fVar164 < 0.0) {
              local_9e0._0_16_ = auVar211;
              local_a00._0_16_ = ZEXT416((uint)fVar142);
              local_a20._0_16_ = auVar260;
              local_820._0_16_ = auVar212;
              local_840._0_4_ = fVar162;
              local_860._0_16_ = auVar94;
              fVar164 = sqrtf(fVar164);
              auVar248 = ZEXT464(auVar91._0_4_);
              uVar81 = extraout_RAX_02;
              fVar162 = (float)local_840._0_4_;
              auVar94 = local_860._0_16_;
              auVar212 = local_820._0_16_;
              auVar211 = local_9e0._0_16_;
              auVar260 = local_a20._0_16_;
              auVar91 = local_a00._0_16_;
            }
            else {
              auVar91 = vsqrtss_avx(auVar249,auVar249);
              fVar164 = auVar91._0_4_;
              auVar91 = ZEXT416((uint)fVar142);
            }
            auVar253 = ZEXT1664(auVar211);
            auVar249 = vpermilps_avx(local_7e0._0_16_,0xff);
            fVar164 = fVar164 - auVar249._0_4_;
            auVar249 = vshufps_avx(auVar228,auVar228,0xff);
            auVar212 = vfmsub213ss_fma(auVar212,ZEXT416((uint)fVar162),auVar249);
            auVar178._0_8_ = auVar260._0_8_ ^ 0x8000000080000000;
            auVar178._8_4_ = auVar260._8_4_ ^ 0x80000000;
            auVar178._12_4_ = auVar260._12_4_ ^ 0x80000000;
            auVar198._0_8_ = auVar212._0_8_ ^ 0x8000000080000000;
            auVar198._8_4_ = auVar212._8_4_ ^ 0x80000000;
            auVar198._12_4_ = auVar212._12_4_ ^ 0x80000000;
            auVar98 = ZEXT416((uint)(auVar94._0_4_ * fVar162));
            auVar94 = vfmsub231ss_fma(ZEXT416((uint)(auVar260._0_4_ * auVar212._0_4_)),auVar91,
                                      auVar98);
            auVar212 = vinsertps_avx(auVar198,auVar98,0x1c);
            uVar89 = auVar94._0_4_;
            auVar199._4_4_ = uVar89;
            auVar199._0_4_ = uVar89;
            auVar199._8_4_ = uVar89;
            auVar199._12_4_ = uVar89;
            auVar212 = vdivps_avx(auVar212,auVar199);
            auVar91 = vinsertps_avx(auVar91,auVar178,0x10);
            auVar91 = vdivps_avx(auVar91,auVar199);
            fVar142 = auVar211._0_4_;
            auVar145._0_4_ = fVar142 * auVar212._0_4_ + fVar164 * auVar91._0_4_;
            auVar145._4_4_ = fVar142 * auVar212._4_4_ + fVar164 * auVar91._4_4_;
            auVar145._8_4_ = fVar142 * auVar212._8_4_ + fVar164 * auVar91._8_4_;
            auVar145._12_4_ = fVar142 * auVar212._12_4_ + fVar164 * auVar91._12_4_;
            auVar97 = vsubps_avx(auVar97,auVar145);
            auVar91 = vandps_avx(auVar211,local_9a0._0_16_);
            if (auVar91._0_4_ < auVar275._0_4_) {
              auVar212 = vfmadd231ss_fma(ZEXT416((uint)(auVar248._0_4_ + auVar275._0_4_)),
                                         local_880._0_16_,ZEXT416(0x36000000));
              auVar91 = vandps_avx(ZEXT416((uint)fVar164),local_9a0._0_16_);
              if (auVar91._0_4_ < auVar212._0_4_) {
                bVar86 = uVar84 < 5;
                fVar160 = auVar97._0_4_ + (float)local_940._0_4_;
                if (fVar160 < fVar88) {
                  bVar87 = 0;
                  goto LAB_012c57a3;
                }
                fVar142 = *(float *)(ray + k * 4 + 0x80);
                auVar248 = ZEXT464((uint)fVar142);
                auVar267 = ZEXT3264(_local_a40);
                if (fVar160 <= fVar142) {
                  auVar91 = vmovshdup_avx(auVar97);
                  bVar87 = 0;
                  if ((auVar91._0_4_ < 0.0) || (bVar87 = 0, 1.0 < auVar91._0_4_)) goto LAB_012c57b5;
                  auVar6 = vrsqrtss_avx(auVar6,auVar6);
                  fVar162 = auVar6._0_4_;
                  pGVar8 = (context->scene->geometries).items[uVar83].ptr;
                  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (bVar87 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      fVar143 = fVar162 * 1.5 + fVar143 * -0.5 * fVar162 * fVar162 * fVar162;
                      auVar146._0_4_ = fVar143 * (float)local_960._0_4_;
                      auVar146._4_4_ = fVar143 * (float)local_960._4_4_;
                      auVar146._8_4_ = fVar143 * fStack_958;
                      auVar146._12_4_ = fVar143 * fStack_954;
                      auVar94 = vfmadd213ps_fma(auVar249,auVar146,auVar228);
                      auVar6 = vshufps_avx(auVar146,auVar146,0xc9);
                      auVar91 = vshufps_avx(auVar228,auVar228,0xc9);
                      auVar147._0_4_ = auVar146._0_4_ * auVar91._0_4_;
                      auVar147._4_4_ = auVar146._4_4_ * auVar91._4_4_;
                      auVar147._8_4_ = auVar146._8_4_ * auVar91._8_4_;
                      auVar147._12_4_ = auVar146._12_4_ * auVar91._12_4_;
                      auVar212 = vfmsub231ps_fma(auVar147,auVar228,auVar6);
                      auVar6 = vshufps_avx(auVar212,auVar212,0xc9);
                      auVar91 = vshufps_avx(auVar94,auVar94,0xc9);
                      auVar212 = vshufps_avx(auVar212,auVar212,0xd2);
                      auVar96._0_4_ = auVar94._0_4_ * auVar212._0_4_;
                      auVar96._4_4_ = auVar94._4_4_ * auVar212._4_4_;
                      auVar96._8_4_ = auVar94._8_4_ * auVar212._8_4_;
                      auVar96._12_4_ = auVar94._12_4_ * auVar212._12_4_;
                      auVar6 = vfmsub231ps_fma(auVar96,auVar6,auVar91);
                      local_770 = vshufps_avx(auVar97,auVar97,0x55);
                      local_7a0 = (RTCHitN  [16])vshufps_avx(auVar6,auVar6,0x55);
                      auStack_790 = vshufps_avx(auVar6,auVar6,0xaa);
                      local_780 = auVar6._0_4_;
                      local_760 = ZEXT416(0) << 0x20;
                      local_750 = CONCAT44(uStack_7bc,local_7c0);
                      uStack_748 = CONCAT44(uStack_7b4,uStack_7b8);
                      local_740._4_4_ = uStack_7ac;
                      local_740._0_4_ = local_7b0;
                      local_740._8_4_ = uStack_7a8;
                      local_740._12_4_ = uStack_7a4;
                      vpcmpeqd_avx2(ZEXT1632(local_740),ZEXT1632(local_740));
                      uStack_72c = context->user->instID[0];
                      local_730 = uStack_72c;
                      uStack_728 = uStack_72c;
                      uStack_724 = uStack_72c;
                      uStack_720 = context->user->instPrimID[0];
                      uStack_71c = uStack_720;
                      uStack_718 = uStack_720;
                      uStack_714 = uStack_720;
                      *(float *)(ray + k * 4 + 0x80) = fVar160;
                      auVar97 = *(undefined1 (*) [16])
                                 (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
                      local_8e0._0_16_ = auVar97;
                      local_a70.valid = (int *)local_8e0;
                      local_a70.geometryUserPtr = pGVar8->userPtr;
                      local_a70.context = context->user;
                      local_a70.hit = local_7a0;
                      local_a70.N = 4;
                      local_a70.ray = (RTCRayN *)ray;
                      uStack_77c = local_780;
                      uStack_778 = local_780;
                      uStack_774 = local_780;
                      if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar253 = ZEXT1664(auVar211);
                        (*pGVar8->occlusionFilterN)(&local_a70);
                        auVar267 = ZEXT3264(_local_a40);
                        auVar97 = local_8e0._0_16_;
                      }
                      if (auVar97 == (undefined1  [16])0x0) {
                        auVar97 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                        auVar97 = auVar97 ^ _DAT_01f46b70;
                      }
                      else {
                        p_Var9 = context->args->filter;
                        if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar253 = ZEXT1664(auVar253._0_16_);
                          (*p_Var9)(&local_a70);
                          auVar267 = ZEXT3264(_local_a40);
                          auVar97 = local_8e0._0_16_;
                        }
                        auVar6 = vpcmpeqd_avx(auVar97,_DAT_01f45a50);
                        auVar97 = auVar6 ^ _DAT_01f46b70;
                        auVar148._8_4_ = 0xff800000;
                        auVar148._0_8_ = 0xff800000ff800000;
                        auVar148._12_4_ = 0xff800000;
                        auVar6 = vblendvps_avx(auVar148,*(undefined1 (*) [16])(local_a70.ray + 0x80)
                                               ,auVar6);
                        *(undefined1 (*) [16])(local_a70.ray + 0x80) = auVar6;
                      }
                      auVar248 = ZEXT464((uint)fVar142);
                      auVar125._8_8_ = 0x100000001;
                      auVar125._0_8_ = 0x100000001;
                      bVar87 = (auVar125 & auVar97) != (undefined1  [16])0x0;
                      if (!(bool)bVar87) {
                        *(float *)(ray + k * 4 + 0x80) = fVar142;
                      }
                    }
                    goto LAB_012c57b5;
                  }
                }
                bVar87 = 0;
                goto LAB_012c57b5;
              }
            }
          }
          bVar86 = false;
LAB_012c57a3:
          auVar267 = ZEXT3264(_local_a40);
LAB_012c57b5:
          uVar89 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar242._4_4_ = uVar89;
          auVar242._0_4_ = uVar89;
          auVar242._8_4_ = uVar89;
          auVar242._12_4_ = uVar89;
          auVar242._16_4_ = uVar89;
          auVar242._20_4_ = uVar89;
          auVar242._24_4_ = uVar89;
          auVar242._28_4_ = uVar89;
          auVar244 = ZEXT3264(auVar242);
          bVar85 = bVar85 | bVar86 & bVar87;
          auVar101 = vcmpps_avx(_local_8a0,auVar242,2);
          local_4c0 = vandps_avx(auVar101,local_4c0);
        }
        auVar113._0_4_ = (float)local_900._0_4_ + (float)local_8c0._0_4_;
        auVar113._4_4_ = (float)local_900._4_4_ + (float)local_8c0._4_4_;
        auVar113._8_4_ = fStack_8f8 + fStack_8b8;
        auVar113._12_4_ = fStack_8f4 + fStack_8b4;
        auVar113._16_4_ = fStack_8f0 + fStack_8b0;
        auVar113._20_4_ = fStack_8ec + fStack_8ac;
        auVar113._24_4_ = fStack_8e8 + fStack_8a8;
        auVar113._28_4_ = fStack_8e4 + fStack_8a4;
        uVar89 = auVar244._0_4_;
        auVar137._4_4_ = uVar89;
        auVar137._0_4_ = uVar89;
        auVar137._8_4_ = uVar89;
        auVar137._12_4_ = uVar89;
        auVar137._16_4_ = uVar89;
        auVar137._20_4_ = uVar89;
        auVar137._24_4_ = uVar89;
        auVar137._28_4_ = uVar89;
        auVar231 = vcmpps_avx(auVar113,auVar137,2);
        _local_8a0 = vandps_avx(auVar231,auVar267._0_32_);
        auVar114._8_4_ = 3;
        auVar114._0_8_ = 0x300000003;
        auVar114._12_4_ = 3;
        auVar114._16_4_ = 3;
        auVar114._20_4_ = 3;
        auVar114._24_4_ = 3;
        auVar114._28_4_ = 3;
        auVar138._8_4_ = 2;
        auVar138._0_8_ = 0x200000002;
        auVar138._12_4_ = 2;
        auVar138._16_4_ = 2;
        auVar138._20_4_ = 2;
        auVar138._24_4_ = 2;
        auVar138._28_4_ = 2;
        auVar231 = vblendvps_avx(auVar138,auVar114,local_620);
        _local_8c0 = vpcmpgtd_avx2(auVar231,local_640);
        local_8e0 = vpandn_avx2(_local_8c0,_local_8a0);
        local_a40._4_4_ = (float)local_900._4_4_ + (float)local_460._4_4_;
        local_a40._0_4_ = (float)local_900._0_4_ + (float)local_460._0_4_;
        fStack_a38 = fStack_8f8 + fStack_458;
        fStack_a34 = fStack_8f4 + fStack_454;
        fStack_a30 = fStack_8f0 + fStack_450;
        fStack_a2c = fStack_8ec + fStack_44c;
        fStack_a28 = fStack_8e8 + fStack_448;
        fStack_a24 = fStack_8e4 + fStack_444;
        auVar267 = ZEXT3264(local_9c0);
        for (; (((((((local_8e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                    (local_8e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (local_8e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  SUB321(local_8e0 >> 0x7f,0) != '\0') ||
                 (local_8e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                SUB321(local_8e0 >> 0xbf,0) != '\0') ||
               (local_8e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               local_8e0[0x1f] < '\0'; local_8e0 = vandps_avx(auVar231,local_8e0)) {
          auVar139._8_4_ = 0x7f800000;
          auVar139._0_8_ = 0x7f8000007f800000;
          auVar139._12_4_ = 0x7f800000;
          auVar139._16_4_ = 0x7f800000;
          auVar139._20_4_ = 0x7f800000;
          auVar139._24_4_ = 0x7f800000;
          auVar139._28_4_ = 0x7f800000;
          auVar231 = vblendvps_avx(auVar139,auVar101,local_8e0);
          auVar12 = vshufps_avx(auVar231,auVar231,0xb1);
          auVar12 = vminps_avx(auVar231,auVar12);
          auVar13 = vshufpd_avx(auVar12,auVar12,5);
          auVar12 = vminps_avx(auVar12,auVar13);
          auVar13 = vpermpd_avx2(auVar12,0x4e);
          auVar12 = vminps_avx(auVar12,auVar13);
          auVar12 = vcmpps_avx(auVar231,auVar12,0);
          auVar13 = local_8e0 & auVar12;
          auVar231 = local_8e0;
          if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar13 >> 0x7f,0) != '\0') ||
                (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar13 >> 0xbf,0) != '\0') ||
              (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar13[0x1f] < '\0') {
            auVar231 = vandps_avx(auVar12,local_8e0);
          }
          uVar78 = vmovmskps_avx(auVar231);
          iVar18 = 0;
          for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
            iVar18 = iVar18 + 1;
          }
          uVar81 = (ulong)(uint)(iVar18 << 2);
          *(undefined4 *)(local_8e0 + uVar81) = 0;
          uVar78 = *(uint *)(local_1c0 + uVar81);
          uVar82 = *(uint *)(local_440 + uVar81);
          fVar143 = auVar1._0_4_;
          if ((float)local_980._0_4_ < 0.0) {
            auVar248 = ZEXT1664(auVar248._0_16_);
            auVar253 = ZEXT1664(auVar253._0_16_);
            fVar143 = sqrtf((float)local_980._0_4_);
            auVar267 = ZEXT3264(local_9c0);
            uVar81 = extraout_RAX_03;
          }
          auVar6 = vminps_avx(auVar3,auVar5);
          auVar97 = vmaxps_avx(auVar3,auVar5);
          auVar91 = vminps_avx(auVar4,auVar2);
          auVar211 = vminps_avx(auVar6,auVar91);
          auVar6 = vmaxps_avx(auVar4,auVar2);
          auVar91 = vmaxps_avx(auVar97,auVar6);
          local_800._8_4_ = 0x7fffffff;
          local_800._0_8_ = 0x7fffffff7fffffff;
          local_800._12_4_ = 0x7fffffff;
          auVar97 = vandps_avx(auVar211,local_800._0_16_);
          auVar6 = vandps_avx(auVar91,local_800._0_16_);
          auVar97 = vmaxps_avx(auVar97,auVar6);
          auVar6 = vmovshdup_avx(auVar97);
          auVar6 = vmaxss_avx(auVar6,auVar97);
          auVar97 = vshufpd_avx(auVar97,auVar97,1);
          auVar97 = vmaxss_avx(auVar97,auVar6);
          fVar160 = auVar97._0_4_ * 1.9073486e-06;
          local_9e0._0_4_ = fVar143 * 1.9073486e-06;
          local_880._0_16_ = vshufps_avx(auVar91,auVar91,0xff);
          auVar97 = vinsertps_avx(ZEXT416(uVar82),ZEXT416(uVar78),0x10);
          for (uVar84 = 0; bVar87 = (byte)uVar81, uVar84 != 5; uVar84 = uVar84 + 1) {
            auVar91 = vmovshdup_avx(auVar97);
            fVar169 = 1.0 - auVar91._0_4_;
            auVar6 = vshufps_avx(auVar97,auVar97,0x55);
            fVar143 = auVar6._0_4_;
            auVar126._0_4_ = fVar118 * fVar143;
            fVar142 = auVar6._4_4_;
            auVar126._4_4_ = auVar5._4_4_ * fVar142;
            fVar162 = auVar6._8_4_;
            auVar126._8_4_ = auVar5._8_4_ * fVar162;
            fVar164 = auVar6._12_4_;
            auVar126._12_4_ = auVar5._12_4_ * fVar164;
            auVar149._4_4_ = fVar169;
            auVar149._0_4_ = fVar169;
            auVar149._8_4_ = fVar169;
            auVar149._12_4_ = fVar169;
            auVar6 = vfmadd231ps_fma(auVar126,auVar149,auVar3);
            auVar179._0_4_ = fVar141 * fVar143;
            auVar179._4_4_ = auVar4._4_4_ * fVar142;
            auVar179._8_4_ = auVar4._8_4_ * fVar162;
            auVar179._12_4_ = auVar4._12_4_ * fVar164;
            auVar211 = vfmadd231ps_fma(auVar179,auVar149,auVar5);
            auVar215._0_4_ = fVar143 * auVar211._0_4_;
            auVar215._4_4_ = fVar142 * auVar211._4_4_;
            auVar215._8_4_ = fVar162 * auVar211._8_4_;
            auVar215._12_4_ = fVar164 * auVar211._12_4_;
            auVar212 = vfmadd231ps_fma(auVar215,auVar149,auVar6);
            auVar127._0_4_ = fVar143 * fVar172;
            auVar127._4_4_ = fVar142 * fStack_b1c;
            auVar127._8_4_ = fVar162 * fStack_b18;
            auVar127._12_4_ = fVar164 * fStack_b14;
            auVar6 = vfmadd231ps_fma(auVar127,auVar149,auVar4);
            auVar200._0_4_ = fVar143 * auVar6._0_4_;
            auVar200._4_4_ = fVar142 * auVar6._4_4_;
            auVar200._8_4_ = fVar162 * auVar6._8_4_;
            auVar200._12_4_ = fVar164 * auVar6._12_4_;
            auVar211 = vfmadd231ps_fma(auVar200,auVar149,auVar211);
            fVar166 = auVar97._0_4_;
            auVar128._4_4_ = fVar166;
            auVar128._0_4_ = fVar166;
            auVar128._8_4_ = fVar166;
            auVar128._12_4_ = fVar166;
            auVar6 = vfmadd213ps_fma(auVar128,local_970,_DAT_01f45a50);
            auVar98._0_4_ = fVar143 * auVar211._0_4_;
            auVar98._4_4_ = fVar142 * auVar211._4_4_;
            auVar98._8_4_ = fVar162 * auVar211._8_4_;
            auVar98._12_4_ = fVar164 * auVar211._12_4_;
            auVar94 = vfmadd231ps_fma(auVar98,auVar212,auVar149);
            local_7e0._0_16_ = auVar94;
            auVar6 = vsubps_avx(auVar6,auVar94);
            _local_960 = auVar6;
            auVar6 = vdpps_avx(auVar6,auVar6,0x7f);
            fVar143 = auVar6._0_4_;
            if (fVar143 < 0.0) {
              local_9a0._0_16_ = auVar212;
              auVar267._0_4_ = sqrtf(fVar143);
              auVar267._4_60_ = extraout_var_00;
              auVar94 = auVar267._0_16_;
              uVar81 = extraout_RAX_04;
              auVar212 = local_9a0._0_16_;
            }
            else {
              auVar94 = vsqrtss_avx(auVar6,auVar6);
            }
            auVar211 = vsubps_avx(auVar211,auVar212);
            auVar229._0_4_ = auVar211._0_4_ * 3.0;
            auVar229._4_4_ = auVar211._4_4_ * 3.0;
            auVar229._8_4_ = auVar211._8_4_ * 3.0;
            auVar229._12_4_ = auVar211._12_4_ * 3.0;
            auVar211 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar169),auVar91
                                      );
            auVar212 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar91,ZEXT416((uint)fVar169)
                                      );
            fVar169 = fVar169 * 6.0;
            fVar142 = auVar211._0_4_ * 6.0;
            fVar162 = auVar212._0_4_ * 6.0;
            fVar164 = auVar91._0_4_ * 6.0;
            auVar180._0_4_ = fVar164 * fVar172;
            auVar180._4_4_ = fVar164 * fStack_b1c;
            auVar180._8_4_ = fVar164 * fStack_b18;
            auVar180._12_4_ = fVar164 * fStack_b14;
            auVar129._4_4_ = fVar162;
            auVar129._0_4_ = fVar162;
            auVar129._8_4_ = fVar162;
            auVar129._12_4_ = fVar162;
            auVar91 = vfmadd132ps_fma(auVar129,auVar180,auVar4);
            auVar181._4_4_ = fVar142;
            auVar181._0_4_ = fVar142;
            auVar181._8_4_ = fVar142;
            auVar181._12_4_ = fVar142;
            auVar91 = vfmadd132ps_fma(auVar181,auVar91,auVar5);
            auVar211 = vdpps_avx(auVar229,auVar229,0x7f);
            auVar130._4_4_ = fVar169;
            auVar130._0_4_ = fVar169;
            auVar130._8_4_ = fVar169;
            auVar130._12_4_ = fVar169;
            auVar249 = vfmadd132ps_fma(auVar130,auVar91,auVar3);
            auVar91 = vblendps_avx(auVar211,_DAT_01f45a50,0xe);
            auVar212 = vrsqrtss_avx(auVar91,auVar91);
            fVar164 = auVar211._0_4_;
            fVar142 = auVar212._0_4_;
            auVar212 = vdpps_avx(auVar229,auVar249,0x7f);
            fVar142 = fVar142 * 1.5 + fVar164 * -0.5 * fVar142 * fVar142 * fVar142;
            auVar131._0_4_ = auVar249._0_4_ * fVar164;
            auVar131._4_4_ = auVar249._4_4_ * fVar164;
            auVar131._8_4_ = auVar249._8_4_ * fVar164;
            auVar131._12_4_ = auVar249._12_4_ * fVar164;
            fVar162 = auVar212._0_4_;
            auVar216._0_4_ = auVar229._0_4_ * fVar162;
            auVar216._4_4_ = auVar229._4_4_ * fVar162;
            auVar216._8_4_ = auVar229._8_4_ * fVar162;
            auVar216._12_4_ = auVar229._12_4_ * fVar162;
            auVar212 = vsubps_avx(auVar131,auVar216);
            auVar91 = vrcpss_avx(auVar91,auVar91);
            auVar249 = vfnmadd213ss_fma(auVar91,auVar211,ZEXT416(0x40000000));
            fVar162 = auVar91._0_4_ * auVar249._0_4_;
            auVar91 = vmaxss_avx(ZEXT416((uint)fVar160),
                                 ZEXT416((uint)(fVar166 * (float)local_9e0._0_4_)));
            auVar253 = ZEXT1664(auVar91);
            uVar68 = CONCAT44(auVar229._4_4_,auVar229._0_4_);
            auVar241._0_8_ = uVar68 ^ 0x8000000080000000;
            auVar241._8_4_ = -auVar229._8_4_;
            auVar241._12_4_ = -auVar229._12_4_;
            auVar182._0_4_ = fVar142 * auVar212._0_4_ * fVar162;
            auVar182._4_4_ = fVar142 * auVar212._4_4_ * fVar162;
            auVar182._8_4_ = fVar142 * auVar212._8_4_ * fVar162;
            auVar182._12_4_ = fVar142 * auVar212._12_4_ * fVar162;
            auVar223._0_4_ = auVar229._0_4_ * fVar142;
            auVar223._4_4_ = auVar229._4_4_ * fVar142;
            auVar223._8_4_ = auVar229._8_4_ * fVar142;
            auVar223._12_4_ = auVar229._12_4_ * fVar142;
            if (fVar164 < -fVar164) {
              local_9a0._0_4_ = auVar94._0_4_;
              local_a00._0_16_ = auVar223;
              local_a20._0_16_ = auVar182;
              fVar142 = sqrtf(fVar164);
              auVar94 = ZEXT416((uint)local_9a0._0_4_);
              auVar253 = ZEXT464(auVar91._0_4_);
              uVar81 = extraout_RAX_05;
              auVar182 = local_a20._0_16_;
              auVar223 = local_a00._0_16_;
            }
            else {
              auVar211 = vsqrtss_avx(auVar211,auVar211);
              fVar142 = auVar211._0_4_;
            }
            auVar211 = vdpps_avx(_local_960,auVar223,0x7f);
            auVar275 = vfmadd213ss_fma(ZEXT416((uint)fVar160),auVar94,auVar253._0_16_);
            auVar212 = vdpps_avx(auVar241,auVar223,0x7f);
            auVar249 = vdpps_avx(_local_960,auVar182,0x7f);
            auVar260 = vdpps_avx(local_970,auVar223,0x7f);
            auVar126 = vfmadd213ss_fma(ZEXT416((uint)(auVar94._0_4_ + 1.0)),
                                       ZEXT416((uint)(fVar160 / fVar142)),auVar275);
            fVar162 = auVar211._0_4_;
            auVar99._0_4_ = fVar162 * fVar162;
            auVar99._4_4_ = auVar211._4_4_ * auVar211._4_4_;
            auVar99._8_4_ = auVar211._8_4_ * auVar211._8_4_;
            auVar99._12_4_ = auVar211._12_4_ * auVar211._12_4_;
            auVar94 = vdpps_avx(_local_960,auVar241,0x7f);
            auVar98 = vsubps_avx(auVar6,auVar99);
            auVar275 = vrsqrtss_avx(auVar98,auVar98);
            fVar164 = auVar98._0_4_;
            fVar142 = auVar275._0_4_;
            fVar142 = fVar142 * 1.5 + fVar164 * -0.5 * fVar142 * fVar142 * fVar142;
            auVar275 = vdpps_avx(_local_960,local_970,0x7f);
            local_9a0._0_16_ = ZEXT416((uint)(auVar212._0_4_ + auVar249._0_4_));
            auVar212 = vfnmadd231ss_fma(auVar94,auVar211,local_9a0._0_16_);
            auVar94 = vfnmadd231ss_fma(auVar275,auVar211,auVar260);
            if (fVar164 < 0.0) {
              local_a00._0_4_ = auVar126._0_4_;
              local_a20._0_16_ = auVar260;
              local_820._0_16_ = auVar212;
              local_840._0_4_ = fVar142;
              local_860._0_16_ = auVar94;
              fVar164 = sqrtf(fVar164);
              auVar253 = ZEXT464(auVar91._0_4_);
              uVar81 = extraout_RAX_06;
              fVar142 = (float)local_840._0_4_;
              auVar94 = local_860._0_16_;
              auVar260 = local_a20._0_16_;
              auVar212 = local_820._0_16_;
              fVar169 = (float)local_a00._0_4_;
            }
            else {
              auVar91 = vsqrtss_avx(auVar98,auVar98);
              fVar164 = auVar91._0_4_;
              fVar169 = auVar126._0_4_;
            }
            auVar248 = ZEXT1664(auVar6);
            auVar267 = ZEXT3264(local_9c0);
            auVar91 = vpermilps_avx(local_7e0._0_16_,0xff);
            fVar164 = fVar164 - auVar91._0_4_;
            auVar249 = vshufps_avx(auVar229,auVar229,0xff);
            auVar91 = vfmsub213ss_fma(auVar212,ZEXT416((uint)fVar142),auVar249);
            auVar183._0_8_ = auVar260._0_8_ ^ 0x8000000080000000;
            auVar183._8_4_ = auVar260._8_4_ ^ 0x80000000;
            auVar183._12_4_ = auVar260._12_4_ ^ 0x80000000;
            auVar201._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
            auVar201._8_4_ = auVar91._8_4_ ^ 0x80000000;
            auVar201._12_4_ = auVar91._12_4_ ^ 0x80000000;
            auVar94 = ZEXT416((uint)(auVar94._0_4_ * fVar142));
            auVar212 = vfmsub231ss_fma(ZEXT416((uint)(auVar91._0_4_ * auVar260._0_4_)),
                                       local_9a0._0_16_,auVar94);
            auVar91 = vinsertps_avx(auVar201,auVar94,0x1c);
            uVar89 = auVar212._0_4_;
            auVar202._4_4_ = uVar89;
            auVar202._0_4_ = uVar89;
            auVar202._8_4_ = uVar89;
            auVar202._12_4_ = uVar89;
            auVar91 = vdivps_avx(auVar91,auVar202);
            auVar212 = vinsertps_avx(local_9a0._0_16_,auVar183,0x10);
            auVar212 = vdivps_avx(auVar212,auVar202);
            auVar150._0_4_ = fVar162 * auVar91._0_4_ + fVar164 * auVar212._0_4_;
            auVar150._4_4_ = fVar162 * auVar91._4_4_ + fVar164 * auVar212._4_4_;
            auVar150._8_4_ = fVar162 * auVar91._8_4_ + fVar164 * auVar212._8_4_;
            auVar150._12_4_ = fVar162 * auVar91._12_4_ + fVar164 * auVar212._12_4_;
            auVar97 = vsubps_avx(auVar97,auVar150);
            auVar91 = vandps_avx(auVar211,local_800._0_16_);
            if (auVar91._0_4_ < fVar169) {
              auVar211 = vfmadd231ss_fma(ZEXT416((uint)(auVar253._0_4_ + fVar169)),local_880._0_16_,
                                         ZEXT416(0x36000000));
              auVar91 = vandps_avx(ZEXT416((uint)fVar164),local_800._0_16_);
              if (auVar91._0_4_ < auVar211._0_4_) {
                bVar86 = uVar84 < 5;
                fVar160 = auVar97._0_4_ + (float)local_940._0_4_;
                if ((fVar88 <= fVar160) &&
                   (fVar142 = *(float *)(ray + k * 4 + 0x80), fVar160 <= fVar142)) {
                  auVar91 = vmovshdup_avx(auVar97);
                  bVar87 = 0;
                  if ((auVar91._0_4_ < 0.0) || (1.0 < auVar91._0_4_)) goto LAB_012c61de;
                  auVar91 = vrsqrtss_avx(auVar6,auVar6);
                  fVar162 = auVar91._0_4_;
                  pGVar8 = (context->scene->geometries).items[uVar83].ptr;
                  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (bVar87 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      fVar143 = fVar162 * 1.5 + fVar143 * -0.5 * fVar162 * fVar162 * fVar162;
                      auVar151._0_4_ = fVar143 * (float)local_960._0_4_;
                      auVar151._4_4_ = fVar143 * (float)local_960._4_4_;
                      auVar151._8_4_ = fVar143 * fStack_958;
                      auVar151._12_4_ = fVar143 * fStack_954;
                      auVar94 = vfmadd213ps_fma(auVar249,auVar151,auVar229);
                      auVar91 = vshufps_avx(auVar151,auVar151,0xc9);
                      auVar211 = vshufps_avx(auVar229,auVar229,0xc9);
                      auVar152._0_4_ = auVar151._0_4_ * auVar211._0_4_;
                      auVar152._4_4_ = auVar151._4_4_ * auVar211._4_4_;
                      auVar152._8_4_ = auVar151._8_4_ * auVar211._8_4_;
                      auVar152._12_4_ = auVar151._12_4_ * auVar211._12_4_;
                      auVar212 = vfmsub231ps_fma(auVar152,auVar229,auVar91);
                      auVar91 = vshufps_avx(auVar212,auVar212,0xc9);
                      auVar211 = vshufps_avx(auVar94,auVar94,0xc9);
                      auVar212 = vshufps_avx(auVar212,auVar212,0xd2);
                      auVar100._0_4_ = auVar94._0_4_ * auVar212._0_4_;
                      auVar100._4_4_ = auVar94._4_4_ * auVar212._4_4_;
                      auVar100._8_4_ = auVar94._8_4_ * auVar212._8_4_;
                      auVar100._12_4_ = auVar94._12_4_ * auVar212._12_4_;
                      auVar91 = vfmsub231ps_fma(auVar100,auVar91,auVar211);
                      local_770 = vshufps_avx(auVar97,auVar97,0x55);
                      local_7a0 = (RTCHitN  [16])vshufps_avx(auVar91,auVar91,0x55);
                      auStack_790 = vshufps_avx(auVar91,auVar91,0xaa);
                      local_780 = auVar91._0_4_;
                      local_760 = ZEXT416(0) << 0x20;
                      local_750 = CONCAT44(uStack_7bc,local_7c0);
                      uStack_748 = CONCAT44(uStack_7b4,uStack_7b8);
                      local_740._4_4_ = uStack_7ac;
                      local_740._0_4_ = local_7b0;
                      local_740._8_4_ = uStack_7a8;
                      local_740._12_4_ = uStack_7a4;
                      vpcmpeqd_avx2(ZEXT1632(local_740),ZEXT1632(local_740));
                      uStack_72c = context->user->instID[0];
                      local_730 = uStack_72c;
                      uStack_728 = uStack_72c;
                      uStack_724 = uStack_72c;
                      uStack_720 = context->user->instPrimID[0];
                      uStack_71c = uStack_720;
                      uStack_718 = uStack_720;
                      uStack_714 = uStack_720;
                      *(float *)(ray + k * 4 + 0x80) = fVar160;
                      local_930 = *(undefined1 (*) [16])
                                   (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
                      local_a70.valid = (int *)local_930;
                      local_a70.geometryUserPtr = pGVar8->userPtr;
                      local_a70.context = context->user;
                      local_a70.hit = local_7a0;
                      local_a70.N = 4;
                      local_a70.ray = (RTCRayN *)ray;
                      uStack_77c = local_780;
                      uStack_778 = local_780;
                      uStack_774 = local_780;
                      if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar248 = ZEXT1664(auVar6);
                        auVar253 = ZEXT1664(auVar253._0_16_);
                        (*pGVar8->occlusionFilterN)(&local_a70);
                        auVar267 = ZEXT3264(local_9c0);
                      }
                      if (local_930 == (undefined1  [16])0x0) {
                        auVar97 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                        auVar97 = auVar97 ^ _DAT_01f46b70;
                      }
                      else {
                        p_Var9 = context->args->filter;
                        if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar248 = ZEXT1664(auVar248._0_16_);
                          auVar253 = ZEXT1664(auVar253._0_16_);
                          (*p_Var9)(&local_a70);
                          auVar267 = ZEXT3264(local_9c0);
                        }
                        auVar6 = vpcmpeqd_avx(local_930,_DAT_01f45a50);
                        auVar97 = auVar6 ^ _DAT_01f46b70;
                        auVar153._8_4_ = 0xff800000;
                        auVar153._0_8_ = 0xff800000ff800000;
                        auVar153._12_4_ = 0xff800000;
                        auVar6 = vblendvps_avx(auVar153,*(undefined1 (*) [16])(local_a70.ray + 0x80)
                                               ,auVar6);
                        *(undefined1 (*) [16])(local_a70.ray + 0x80) = auVar6;
                      }
                      auVar132._8_8_ = 0x100000001;
                      auVar132._0_8_ = 0x100000001;
                      bVar87 = (auVar132 & auVar97) != (undefined1  [16])0x0;
                      if (!(bool)bVar87) {
                        *(float *)(ray + k * 4 + 0x80) = fVar142;
                      }
                    }
                    goto LAB_012c61de;
                  }
                }
                bVar87 = 0;
                goto LAB_012c61de;
              }
            }
          }
          bVar86 = false;
LAB_012c61de:
          uVar89 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar243._4_4_ = uVar89;
          auVar243._0_4_ = uVar89;
          auVar243._8_4_ = uVar89;
          auVar243._12_4_ = uVar89;
          auVar243._16_4_ = uVar89;
          auVar243._20_4_ = uVar89;
          auVar243._24_4_ = uVar89;
          auVar243._28_4_ = uVar89;
          auVar244 = ZEXT3264(auVar243);
          bVar85 = bVar85 | bVar86 & bVar87;
          auVar231 = vcmpps_avx(_local_a40,auVar243,2);
        }
        auVar140._0_4_ = (float)local_900._0_4_ + local_4a0._0_4_;
        auVar140._4_4_ = (float)local_900._4_4_ + local_4a0._4_4_;
        auVar140._8_4_ = fStack_8f8 + local_4a0._8_4_;
        auVar140._12_4_ = fStack_8f4 + local_4a0._12_4_;
        auVar140._16_4_ = fStack_8f0 + local_4a0._16_4_;
        auVar140._20_4_ = fStack_8ec + local_4a0._20_4_;
        auVar140._24_4_ = fStack_8e8 + local_4a0._24_4_;
        auVar140._28_4_ = fStack_8e4 + local_4a0._28_4_;
        uVar89 = auVar244._0_4_;
        auVar193._4_4_ = uVar89;
        auVar193._0_4_ = uVar89;
        auVar193._8_4_ = uVar89;
        auVar193._12_4_ = uVar89;
        auVar193._16_4_ = uVar89;
        auVar193._20_4_ = uVar89;
        auVar193._24_4_ = uVar89;
        auVar193._28_4_ = uVar89;
        auVar231 = vcmpps_avx(auVar140,auVar193,2);
        auVar101 = vandps_avx(local_600,local_5e0);
        auVar101 = vandps_avx(auVar231,auVar101);
        auVar210._0_4_ = (float)local_900._0_4_ + local_460._0_4_;
        auVar210._4_4_ = (float)local_900._4_4_ + local_460._4_4_;
        auVar210._8_4_ = fStack_8f8 + local_460._8_4_;
        auVar210._12_4_ = fStack_8f4 + local_460._12_4_;
        auVar210._16_4_ = fStack_8f0 + local_460._16_4_;
        auVar210._20_4_ = fStack_8ec + local_460._20_4_;
        auVar210._24_4_ = fStack_8e8 + local_460._24_4_;
        auVar210._28_4_ = fStack_8e4 + local_460._28_4_;
        auVar12 = vcmpps_avx(auVar210,auVar193,2);
        auVar231 = vandps_avx(_local_8c0,_local_8a0);
        auVar231 = vandps_avx(auVar12,auVar231);
        auVar231 = vorps_avx(auVar101,auVar231);
        fVar142 = (float)local_900._0_4_;
        fVar169 = (float)local_900._4_4_;
        fVar159 = fStack_8f8;
        fVar171 = fStack_8f4;
        fVar161 = fStack_8f0;
        fVar269 = fStack_8ec;
        fVar270 = fStack_8e8;
        fVar255 = fStack_8e4;
        if ((((((((auVar231 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar231 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar231 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar231 >> 0x7f,0) != '\0') ||
              (auVar231 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar231 >> 0xbf,0) != '\0') ||
            (auVar231 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar231[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar79 * 0x60) = auVar231;
          auVar101 = vblendvps_avx(_local_460,local_4a0,auVar101);
          *(undefined1 (*) [32])(auStack_160 + uVar79 * 0x60) = auVar101;
          uVar81 = vmovlps_avx(local_5b0);
          (&uStack_140)[uVar79 * 0xc] = uVar81;
          aiStack_138[uVar79 * 0x18] = local_c0c + 1;
          uVar79 = (ulong)((int)uVar79 + 1);
        }
      }
    }
    while( true ) {
      auVar203 = local_540;
      auVar231 = local_560;
      auVar245 = local_580;
      uVar78 = (uint)uVar79;
      if (uVar78 == 0) {
        if (bVar85 != 0) goto LAB_012c66ba;
        uVar89 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar116._4_4_ = uVar89;
        auVar116._0_4_ = uVar89;
        auVar116._8_4_ = uVar89;
        auVar116._12_4_ = uVar89;
        auVar116._16_4_ = uVar89;
        auVar116._20_4_ = uVar89;
        auVar116._24_4_ = uVar89;
        auVar116._28_4_ = uVar89;
        auVar101 = vcmpps_avx(local_3c0,auVar116,2);
        uVar83 = vmovmskps_avx(auVar101);
        uVar83 = (uint)local_910 & uVar83;
        goto LAB_012c40ae;
      }
      uVar79 = (ulong)(uVar78 - 1);
      lVar80 = uVar79 * 0x60;
      auVar101 = *(undefined1 (*) [32])(auStack_160 + lVar80);
      auVar110._0_4_ = fVar142 + auVar101._0_4_;
      auVar110._4_4_ = fVar169 + auVar101._4_4_;
      auVar110._8_4_ = fVar159 + auVar101._8_4_;
      auVar110._12_4_ = fVar171 + auVar101._12_4_;
      auVar110._16_4_ = fVar161 + auVar101._16_4_;
      auVar110._20_4_ = fVar269 + auVar101._20_4_;
      auVar110._24_4_ = fVar270 + auVar101._24_4_;
      auVar110._28_4_ = fVar255 + auVar101._28_4_;
      uVar89 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar188._4_4_ = uVar89;
      auVar188._0_4_ = uVar89;
      auVar188._8_4_ = uVar89;
      auVar188._12_4_ = uVar89;
      auVar188._16_4_ = uVar89;
      auVar188._20_4_ = uVar89;
      auVar188._24_4_ = uVar89;
      auVar188._28_4_ = uVar89;
      auVar12 = vcmpps_avx(auVar110,auVar188,2);
      _local_7a0 = vandps_avx(auVar12,*(undefined1 (*) [32])(auStack_180 + lVar80));
      auVar12 = *(undefined1 (*) [32])(auStack_180 + lVar80) & auVar12;
      if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar12 >> 0x7f,0) != '\0') ||
            (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0xbf,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar12[0x1f] < '\0') break;
      uVar79 = (ulong)(uVar78 - 1);
    }
    auVar154._8_4_ = 0x7f800000;
    auVar154._0_8_ = 0x7f8000007f800000;
    auVar154._12_4_ = 0x7f800000;
    auVar154._16_4_ = 0x7f800000;
    auVar154._20_4_ = 0x7f800000;
    auVar154._24_4_ = 0x7f800000;
    auVar154._28_4_ = 0x7f800000;
    auVar101 = vblendvps_avx(auVar154,auVar101,_local_7a0);
    auVar12 = vshufps_avx(auVar101,auVar101,0xb1);
    auVar12 = vminps_avx(auVar101,auVar12);
    auVar13 = vshufpd_avx(auVar12,auVar12,5);
    auVar12 = vminps_avx(auVar12,auVar13);
    auVar13 = vpermpd_avx2(auVar12,0x4e);
    auVar12 = vminps_avx(auVar12,auVar13);
    auVar12 = vcmpps_avx(auVar101,auVar12,0);
    auVar13 = _local_7a0 & auVar12;
    auVar101 = _local_7a0;
    if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0x7f,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0xbf,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0')
    {
      auVar101 = vandps_avx(auVar12,_local_7a0);
    }
    uVar82 = vmovmskps_avx(auVar101);
    iVar18 = 0;
    for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000) {
      iVar18 = iVar18 + 1;
    }
    *(undefined4 *)(local_7a0 + (uint)(iVar18 << 2)) = 0;
    uVar81 = (&uStack_140)[uVar79 * 0xc];
    auVar92._8_8_ = 0;
    auVar92._0_8_ = uVar81;
    local_c0c = aiStack_138[uVar79 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar80) = _local_7a0;
    uVar82 = uVar78 - 1;
    if ((((((((_local_7a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_7a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_7a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_7a0 >> 0x7f,0) != '\0') ||
          (_local_7a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_7a0 >> 0xbf,0) != '\0') ||
        (_local_7a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_7a0[0x1f] < '\0') {
      uVar82 = uVar78;
    }
    uVar89 = (undefined4)uVar81;
    auVar134._4_4_ = uVar89;
    auVar134._0_4_ = uVar89;
    auVar134._8_4_ = uVar89;
    auVar134._12_4_ = uVar89;
    auVar134._16_4_ = uVar89;
    auVar134._20_4_ = uVar89;
    auVar134._24_4_ = uVar89;
    auVar134._28_4_ = uVar89;
    auVar97 = vmovshdup_avx(auVar92);
    auVar97 = vsubps_avx(auVar97,auVar92);
    auVar111._0_4_ = auVar97._0_4_;
    auVar111._4_4_ = auVar111._0_4_;
    auVar111._8_4_ = auVar111._0_4_;
    auVar111._12_4_ = auVar111._0_4_;
    auVar111._16_4_ = auVar111._0_4_;
    auVar111._20_4_ = auVar111._0_4_;
    auVar111._24_4_ = auVar111._0_4_;
    auVar111._28_4_ = auVar111._0_4_;
    auVar97 = vfmadd132ps_fma(auVar111,auVar134,_DAT_01f7b040);
    local_4a0 = ZEXT1632(auVar97);
    local_5b0._8_8_ = 0;
    local_5b0._0_8_ = *(ulong *)(local_4a0 + (uint)(iVar18 << 2));
    uVar79 = (ulong)uVar82;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }